

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [12];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  uint uVar58;
  ulong uVar59;
  undefined1 (*pauVar60) [32];
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  int iVar66;
  undefined4 uVar67;
  undefined8 uVar68;
  vint4 bi_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar74 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar94;
  float fVar95;
  float fVar117;
  float fVar118;
  vint4 bi_1;
  undefined1 auVar124 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar161;
  float fVar162;
  vint4 ai_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar163;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar202;
  float fVar203;
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar215 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  vint4 ai_1;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [28];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [64];
  float fVar234;
  undefined1 auVar231 [16];
  float fVar235;
  undefined1 auVar232 [32];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar233 [64];
  undefined1 auVar239 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar245;
  float fVar246;
  undefined1 auVar240 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [64];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  RTCFilterFunctionNArguments args;
  vboolx_conflict valid1;
  vboolx_conflict valid0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_acc;
  undefined1 local_aa0 [32];
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8b0;
  float local_8a8;
  float local_8a4;
  undefined4 local_8a0;
  uint local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  undefined8 local_880;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 local_780 [32];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  uint uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar3 = prim[1];
  uVar65 = (ulong)(byte)PVar3;
  fVar95 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar124 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  auVar69._0_4_ = fVar95 * auVar124._0_4_;
  auVar69._4_4_ = fVar95 * auVar124._4_4_;
  auVar69._8_4_ = fVar95 * auVar124._8_4_;
  auVar69._12_4_ = fVar95 * auVar124._12_4_;
  auVar185._0_4_ = fVar95 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar185._4_4_ = fVar95 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar185._8_4_ = fVar95 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar185._12_4_ = fVar95 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xb + 6)));
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar65 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  uVar59 = (ulong)(uint)((int)(uVar65 * 9) * 2);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + uVar65 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar59 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar254._4_4_ = auVar185._0_4_;
  auVar254._0_4_ = auVar185._0_4_;
  auVar254._8_4_ = auVar185._0_4_;
  auVar254._12_4_ = auVar185._0_4_;
  auVar97 = vshufps_avx(auVar185,auVar185,0x55);
  auVar70 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar95 = auVar70._0_4_;
  auVar239._0_4_ = fVar95 * auVar7._0_4_;
  fVar117 = auVar70._4_4_;
  auVar239._4_4_ = fVar117 * auVar7._4_4_;
  fVar118 = auVar70._8_4_;
  auVar239._8_4_ = fVar118 * auVar7._8_4_;
  fVar119 = auVar70._12_4_;
  auVar239._12_4_ = fVar119 * auVar7._12_4_;
  auVar231._0_4_ = auVar8._0_4_ * fVar95;
  auVar231._4_4_ = auVar8._4_4_ * fVar117;
  auVar231._8_4_ = auVar8._8_4_ * fVar118;
  auVar231._12_4_ = auVar8._12_4_ * fVar119;
  auVar219._0_4_ = auVar123._0_4_ * fVar95;
  auVar219._4_4_ = auVar123._4_4_ * fVar117;
  auVar219._8_4_ = auVar123._8_4_ * fVar118;
  auVar219._12_4_ = auVar123._12_4_ * fVar119;
  auVar70 = vfmadd231ps_fma(auVar239,auVar97,auVar79);
  auVar98 = vfmadd231ps_fma(auVar231,auVar97,auVar191);
  auVar97 = vfmadd231ps_fma(auVar219,auVar71,auVar97);
  auVar140 = vfmadd231ps_fma(auVar70,auVar254,auVar124);
  auVar98 = vfmadd231ps_fma(auVar98,auVar254,auVar170);
  auVar168 = vfmadd231ps_fma(auVar97,auVar72,auVar254);
  auVar255._4_4_ = auVar69._0_4_;
  auVar255._0_4_ = auVar69._0_4_;
  auVar255._8_4_ = auVar69._0_4_;
  auVar255._12_4_ = auVar69._0_4_;
  auVar97 = vshufps_avx(auVar69,auVar69,0x55);
  auVar70 = vshufps_avx(auVar69,auVar69,0xaa);
  fVar95 = auVar70._0_4_;
  auVar186._0_4_ = fVar95 * auVar7._0_4_;
  fVar117 = auVar70._4_4_;
  auVar186._4_4_ = fVar117 * auVar7._4_4_;
  fVar118 = auVar70._8_4_;
  auVar186._8_4_ = fVar118 * auVar7._8_4_;
  fVar119 = auVar70._12_4_;
  auVar186._12_4_ = fVar119 * auVar7._12_4_;
  auVar96._0_4_ = auVar8._0_4_ * fVar95;
  auVar96._4_4_ = auVar8._4_4_ * fVar117;
  auVar96._8_4_ = auVar8._8_4_ * fVar118;
  auVar96._12_4_ = auVar8._12_4_ * fVar119;
  auVar70._0_4_ = auVar123._0_4_ * fVar95;
  auVar70._4_4_ = auVar123._4_4_ * fVar117;
  auVar70._8_4_ = auVar123._8_4_ * fVar118;
  auVar70._12_4_ = auVar123._12_4_ * fVar119;
  auVar79 = vfmadd231ps_fma(auVar186,auVar97,auVar79);
  auVar7 = vfmadd231ps_fma(auVar96,auVar97,auVar191);
  auVar191 = vfmadd231ps_fma(auVar70,auVar97,auVar71);
  auVar8 = vfmadd231ps_fma(auVar79,auVar255,auVar124);
  auVar71 = vfmadd231ps_fma(auVar7,auVar255,auVar170);
  auVar123 = vfmadd231ps_fma(auVar191,auVar255,auVar72);
  local_950._8_4_ = 0x7fffffff;
  local_950._0_8_ = 0x7fffffff7fffffff;
  local_950._12_4_ = 0x7fffffff;
  auVar124 = vandps_avx(auVar140,local_950);
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar124 = vcmpps_avx(auVar124,auVar167,1);
  auVar79 = vblendvps_avx(auVar140,auVar167,auVar124);
  auVar124 = vandps_avx(auVar98,local_950);
  auVar124 = vcmpps_avx(auVar124,auVar167,1);
  auVar7 = vblendvps_avx(auVar98,auVar167,auVar124);
  auVar124 = vandps_avx(auVar168,local_950);
  auVar124 = vcmpps_avx(auVar124,auVar167,1);
  auVar124 = vblendvps_avx(auVar168,auVar167,auVar124);
  auVar170 = vrcpps_avx(auVar79);
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = 0x3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar79,auVar170,auVar212);
  auVar170 = vfmadd132ps_fma(auVar79,auVar170,auVar170);
  auVar79 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar79,auVar212);
  auVar191 = vfmadd132ps_fma(auVar7,auVar79,auVar79);
  auVar79 = vrcpps_avx(auVar124);
  auVar124 = vfnmadd213ps_fma(auVar124,auVar79,auVar212);
  auVar72 = vfmadd132ps_fma(auVar124,auVar79,auVar79);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar124 = vpmovsxwd_avx(auVar124);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar8);
  auVar168._0_4_ = auVar170._0_4_ * auVar124._0_4_;
  auVar168._4_4_ = auVar170._4_4_ * auVar124._4_4_;
  auVar168._8_4_ = auVar170._8_4_ * auVar124._8_4_;
  auVar168._12_4_ = auVar170._12_4_ * auVar124._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar124 = vpmovsxwd_avx(auVar79);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar8);
  auVar187._0_4_ = auVar170._0_4_ * auVar124._0_4_;
  auVar187._4_4_ = auVar170._4_4_ * auVar124._4_4_;
  auVar187._8_4_ = auVar170._8_4_ * auVar124._8_4_;
  auVar187._12_4_ = auVar170._12_4_ * auVar124._12_4_;
  auVar98._1_3_ = 0;
  auVar98[0] = PVar3;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar79 = vpmovsxwd_avx(auVar7);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar65 * -2 + 6);
  auVar124 = vpmovsxwd_avx(auVar170);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar71);
  auVar220._0_4_ = auVar124._0_4_ * auVar191._0_4_;
  auVar220._4_4_ = auVar124._4_4_ * auVar191._4_4_;
  auVar220._8_4_ = auVar124._8_4_ * auVar191._8_4_;
  auVar220._12_4_ = auVar124._12_4_ * auVar191._12_4_;
  auVar124 = vcvtdq2ps_avx(auVar79);
  auVar124 = vsubps_avx(auVar124,auVar71);
  auVar97._0_4_ = auVar191._0_4_ * auVar124._0_4_;
  auVar97._4_4_ = auVar191._4_4_ * auVar124._4_4_;
  auVar97._8_4_ = auVar191._8_4_ * auVar124._8_4_;
  auVar97._12_4_ = auVar191._12_4_ * auVar124._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar59 + uVar65 + 6);
  auVar124 = vpmovsxwd_avx(auVar191);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar123);
  auVar140._0_4_ = auVar72._0_4_ * auVar124._0_4_;
  auVar140._4_4_ = auVar72._4_4_ * auVar124._4_4_;
  auVar140._8_4_ = auVar72._8_4_ * auVar124._8_4_;
  auVar140._12_4_ = auVar72._12_4_ * auVar124._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar65 * 0x17 + 6);
  auVar124 = vpmovsxwd_avx(auVar8);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar124 = vsubps_avx(auVar124,auVar123);
  auVar71._0_4_ = auVar72._0_4_ * auVar124._0_4_;
  auVar71._4_4_ = auVar72._4_4_ * auVar124._4_4_;
  auVar71._8_4_ = auVar72._8_4_ * auVar124._8_4_;
  auVar71._12_4_ = auVar72._12_4_ * auVar124._12_4_;
  auVar124 = vpminsd_avx(auVar168,auVar187);
  auVar79 = vpminsd_avx(auVar220,auVar97);
  auVar124 = vmaxps_avx(auVar124,auVar79);
  auVar79 = vpminsd_avx(auVar140,auVar71);
  uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar225._4_4_ = uVar67;
  auVar225._0_4_ = uVar67;
  auVar225._8_4_ = uVar67;
  auVar225._12_4_ = uVar67;
  auVar79 = vmaxps_avx(auVar79,auVar225);
  auVar124 = vmaxps_avx(auVar124,auVar79);
  local_400._0_4_ = auVar124._0_4_ * 0.99999964;
  local_400._4_4_ = auVar124._4_4_ * 0.99999964;
  local_400._8_4_ = auVar124._8_4_ * 0.99999964;
  local_400._12_4_ = auVar124._12_4_ * 0.99999964;
  auVar124 = vpmaxsd_avx(auVar168,auVar187);
  auVar79 = vpmaxsd_avx(auVar220,auVar97);
  auVar124 = vminps_avx(auVar124,auVar79);
  auVar79 = vpmaxsd_avx(auVar140,auVar71);
  fVar95 = (ray->super_RayK<1>).tfar;
  auVar123._4_4_ = fVar95;
  auVar123._0_4_ = fVar95;
  auVar123._8_4_ = fVar95;
  auVar123._12_4_ = fVar95;
  auVar79 = vminps_avx(auVar79,auVar123);
  auVar124 = vminps_avx(auVar124,auVar79);
  auVar72._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar72._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar72._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar72._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar98[4] = PVar3;
  auVar98._5_3_ = 0;
  auVar98[8] = PVar3;
  auVar98._9_3_ = 0;
  auVar98[0xc] = PVar3;
  auVar98._13_3_ = 0;
  auVar79 = vpcmpgtd_avx(auVar98,_DAT_01f7fcf0);
  auVar124 = vcmpps_avx(local_400,auVar72,2);
  auVar124 = vandps_avx(auVar124,auVar79);
  uVar58 = vmovmskps_avx(auVar124);
  if (uVar58 == 0) {
    return;
  }
  uVar58 = uVar58 & 0xff;
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  local_6e0 = 0x7fffffff;
  uStack_6dc = 0x7fffffff;
  uStack_6d8 = 0x7fffffff;
  uStack_6d4 = 0x7fffffff;
  uStack_6d0 = 0x7fffffff;
  uStack_6cc = 0x7fffffff;
  uStack_6c8 = 0x7fffffff;
  uStack_6c4 = 0x7fffffff;
  local_4c0 = 0x80000000;
  uStack_4bc = 0x80000000;
  uStack_4b8 = 0x80000000;
  uStack_4b4 = 0x80000000;
  fStack_4b0 = -0.0;
  fStack_4ac = -0.0;
  fStack_4a8 = -0.0;
  uStack_4a4 = 0x80000000;
LAB_0162d6b7:
  lVar64 = 0;
  uVar65 = (ulong)uVar58;
  for (uVar59 = uVar65; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar58 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar58].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar64 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar124 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar59);
  auVar79 = *(undefined1 (*) [16])(lVar6 + (uVar59 + 1) * (long)p_Var5);
  auVar7 = *(undefined1 (*) [16])(lVar6 + (uVar59 + 2) * (long)p_Var5);
  uVar65 = uVar65 - 1 & uVar65;
  auVar170 = *(undefined1 (*) [16])(lVar6 + (uVar59 + 3) * (long)p_Var5);
  if (uVar65 != 0) {
    uVar63 = uVar65 - 1 & uVar65;
    for (uVar59 = uVar65; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    }
    if (uVar63 != 0) {
      for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar188._0_4_ = (auVar124._0_4_ + auVar79._0_4_ + auVar7._0_4_ + auVar170._0_4_) * 0.25;
  auVar188._4_4_ = (auVar124._4_4_ + auVar79._4_4_ + auVar7._4_4_ + auVar170._4_4_) * 0.25;
  auVar188._8_4_ = (auVar124._8_4_ + auVar79._8_4_ + auVar7._8_4_ + auVar170._8_4_) * 0.25;
  auVar188._12_4_ = (auVar124._12_4_ + auVar79._12_4_ + auVar7._12_4_ + auVar170._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar191 = vsubps_avx(auVar188,(undefined1  [16])aVar1);
  auVar191 = vdpps_avx(auVar191,(undefined1  [16])aVar2,0x7f);
  auVar8 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar72 = vrcpss_avx(auVar8,auVar8);
  auVar8 = vfnmadd213ss_fma(auVar72,auVar8,ZEXT416(0x40000000));
  fVar95 = auVar191._0_4_ * auVar72._0_4_ * auVar8._0_4_;
  local_750 = ZEXT416((uint)fVar95);
  auVar189._4_4_ = fVar95;
  auVar189._0_4_ = fVar95;
  auVar189._8_4_ = fVar95;
  auVar189._12_4_ = fVar95;
  fStack_7d0 = fVar95;
  _local_7e0 = auVar189;
  fStack_7cc = fVar95;
  fStack_7c8 = fVar95;
  fStack_7c4 = fVar95;
  auVar191 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar189);
  auVar191 = vblendps_avx(auVar191,_DAT_01f7aa10,8);
  local_910 = vsubps_avx(auVar124,auVar191);
  local_920 = vsubps_avx(auVar7,auVar191);
  local_930 = vsubps_avx(auVar79,auVar191);
  _local_940 = vsubps_avx(auVar170,auVar191);
  auVar124 = vmovshdup_avx(local_910);
  local_1e0 = auVar124._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar124 = vshufps_avx(local_910,local_910,0xaa);
  uVar68 = auVar124._0_8_;
  local_980._8_8_ = uVar68;
  local_980._0_8_ = uVar68;
  local_980._16_8_ = uVar68;
  local_980._24_8_ = uVar68;
  auVar258 = ZEXT3264(local_980);
  auVar124 = vshufps_avx(local_910,local_910,0xff);
  uVar68 = auVar124._0_8_;
  local_6a0._8_8_ = uVar68;
  local_6a0._0_8_ = uVar68;
  local_6a0._16_8_ = uVar68;
  local_6a0._24_8_ = uVar68;
  auVar124 = vmovshdup_avx(local_930);
  uVar68 = auVar124._0_8_;
  local_9a0._8_8_ = uVar68;
  local_9a0._0_8_ = uVar68;
  local_9a0._16_8_ = uVar68;
  local_9a0._24_8_ = uVar68;
  auVar248 = ZEXT3264(local_9a0);
  auVar124 = vshufps_avx(local_930,local_930,0xaa);
  uVar68 = auVar124._0_8_;
  local_9c0._8_8_ = uVar68;
  local_9c0._0_8_ = uVar68;
  local_9c0._16_8_ = uVar68;
  local_9c0._24_8_ = uVar68;
  auVar253 = ZEXT3264(local_9c0);
  auVar124 = vshufps_avx(local_930,local_930,0xff);
  uVar68 = auVar124._0_8_;
  local_9e0._8_8_ = uVar68;
  local_9e0._0_8_ = uVar68;
  local_9e0._16_8_ = uVar68;
  local_9e0._24_8_ = uVar68;
  auVar218 = ZEXT3264(local_9e0);
  auVar124 = vmovshdup_avx(local_920);
  local_300 = auVar124._0_4_;
  fStack_2fc = auVar124._4_4_;
  auVar124 = vshufps_avx(local_920,local_920,0xaa);
  local_320 = auVar124._0_4_;
  fStack_31c = auVar124._4_4_;
  auVar124 = vshufps_avx(local_920,local_920,0xff);
  local_200 = auVar124._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar124 = vmovshdup_avx(_local_940);
  local_220 = auVar124._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar124 = vshufps_avx(_local_940,_local_940,0xaa);
  local_240 = auVar124._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar124 = vshufps_avx(_local_940,_local_940,0xff);
  local_260 = auVar124._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar73._0_4_ = aVar2.x * aVar2.x;
  auVar73._4_4_ = aVar2.y * aVar2.y;
  auVar73._8_4_ = aVar2.z * aVar2.z;
  auVar73._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar124 = vshufps_avx(auVar73,auVar73,0xaa);
  uVar68 = auVar124._0_8_;
  auVar240._8_8_ = uVar68;
  auVar240._0_8_ = uVar68;
  auVar240._16_8_ = uVar68;
  auVar240._24_8_ = uVar68;
  uVar67 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_660._4_4_ = uVar67;
  local_660._0_4_ = uVar67;
  fStack_658 = (float)uVar67;
  fStack_654 = (float)uVar67;
  fStack_650 = (float)uVar67;
  fStack_64c = (float)uVar67;
  fStack_648 = (float)uVar67;
  register0x0000145c = uVar67;
  auVar230 = ZEXT3264(_local_660);
  uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_680._4_4_ = uVar67;
  local_680._0_4_ = uVar67;
  fStack_678 = (float)uVar67;
  fStack_674 = (float)uVar67;
  fStack_670 = (float)uVar67;
  fStack_66c = (float)uVar67;
  fStack_668 = (float)uVar67;
  register0x0000149c = uVar67;
  auVar233 = ZEXT3264(_local_680);
  auVar124 = vfmadd231ps_fma(auVar240,_local_680,_local_680);
  auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),_local_660,_local_660);
  auVar243 = ZEXT1664(auVar124);
  local_acc = 1;
  uVar63 = 0;
  local_440 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_43c = local_440;
  fStack_438 = local_440;
  fStack_434 = local_440;
  fStack_430 = local_440;
  fStack_42c = local_440;
  fStack_428 = local_440;
  fStack_424 = local_440;
  uVar67 = local_910._0_4_;
  local_900._4_4_ = uVar67;
  local_900._0_4_ = uVar67;
  local_900._8_4_ = uVar67;
  local_900._12_4_ = uVar67;
  local_900._16_4_ = uVar67;
  local_900._20_4_ = uVar67;
  local_900._24_4_ = uVar67;
  local_900._28_4_ = uVar67;
  auVar224 = ZEXT3264(local_900);
  local_2c0._0_4_ = local_930._0_4_;
  local_2c0._4_4_ = local_2c0._0_4_;
  local_2c0._8_4_ = local_2c0._0_4_;
  local_2c0._12_4_ = local_2c0._0_4_;
  local_2c0._16_4_ = local_2c0._0_4_;
  local_2c0._20_4_ = local_2c0._0_4_;
  local_2c0._24_4_ = local_2c0._0_4_;
  local_2c0._28_4_ = local_2c0._0_4_;
  uVar67 = local_920._0_4_;
  local_2e0._4_4_ = uVar67;
  local_2e0._0_4_ = uVar67;
  local_2e0._8_4_ = uVar67;
  local_2e0._12_4_ = uVar67;
  local_2e0._16_4_ = uVar67;
  local_2e0._20_4_ = uVar67;
  local_2e0._24_4_ = uVar67;
  local_2e0._28_4_ = uVar67;
  local_2a0 = local_940._0_4_;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  auVar9._4_4_ = uStack_6dc;
  auVar9._0_4_ = local_6e0;
  auVar9._8_4_ = uStack_6d8;
  auVar9._12_4_ = uStack_6d4;
  auVar9._16_4_ = uStack_6d0;
  auVar9._20_4_ = uStack_6cc;
  auVar9._24_4_ = uStack_6c8;
  auVar9._28_4_ = uStack_6c4;
  local_360 = vandps_avx(ZEXT1632(auVar124),auVar9);
  local_3f0 = ZEXT816(0x3f80000000000000);
  local_280 = ZEXT1632(auVar124);
  uVar59 = (ulong)*(uint *)(prim + lVar64 * 4 + 6);
  fStack_318 = local_320;
  fStack_314 = fStack_31c;
  fStack_310 = local_320;
  fStack_30c = fStack_31c;
  fStack_308 = local_320;
  fStack_304 = fStack_31c;
  fStack_2f8 = local_300;
  fStack_2f4 = fStack_2fc;
  fStack_2f0 = local_300;
  fStack_2ec = fStack_2fc;
  fStack_2e8 = local_300;
  fStack_2e4 = fStack_2fc;
  do {
    auVar176._8_4_ = 0x3f800000;
    auVar176._0_8_ = 0x3f8000003f800000;
    auVar176._12_4_ = 0x3f800000;
    auVar176._16_4_ = 0x3f800000;
    auVar176._20_4_ = 0x3f800000;
    iVar66 = (int)uVar63;
    auVar176._24_4_ = 0x3f800000;
    auVar176._28_4_ = 0x3f800000;
    auVar124 = vmovshdup_avx(local_3f0);
    auVar124 = vsubps_avx(auVar124,local_3f0);
    fVar94 = auVar124._0_4_;
    fVar122 = fVar94 * 0.04761905;
    local_5e0._0_4_ = local_3f0._0_4_;
    local_5e0._4_4_ = local_5e0._0_4_;
    local_5e0._8_4_ = local_5e0._0_4_;
    local_5e0._12_4_ = local_5e0._0_4_;
    local_5e0._16_4_ = local_5e0._0_4_;
    local_5e0._20_4_ = local_5e0._0_4_;
    local_5e0._24_4_ = local_5e0._0_4_;
    local_5e0._28_4_ = local_5e0._0_4_;
    local_600._4_4_ = fVar94;
    local_600._0_4_ = fVar94;
    local_600._8_4_ = fVar94;
    local_600._12_4_ = fVar94;
    local_600._16_4_ = fVar94;
    local_600._20_4_ = fVar94;
    local_600._24_4_ = fVar94;
    local_600._28_4_ = fVar94;
    auVar124 = vfmadd231ps_fma(local_5e0,local_600,_DAT_01faff20);
    auVar83 = vsubps_avx(auVar176,ZEXT1632(auVar124));
    fVar95 = auVar124._0_4_;
    auVar244._0_4_ = local_2c0._0_4_ * fVar95;
    fVar117 = auVar124._4_4_;
    auVar244._4_4_ = local_2c0._4_4_ * fVar117;
    fVar118 = auVar124._8_4_;
    auVar244._8_4_ = local_2c0._8_4_ * fVar118;
    fVar119 = auVar124._12_4_;
    auVar244._12_4_ = local_2c0._12_4_ * fVar119;
    auVar244._16_4_ = local_2c0._16_4_ * 0.0;
    auVar244._20_4_ = local_2c0._20_4_ * 0.0;
    auVar244._28_36_ = auVar243._28_36_;
    auVar244._24_4_ = local_2c0._24_4_ * 0.0;
    auVar115._0_4_ = auVar248._0_4_ * fVar95;
    auVar115._4_4_ = auVar248._4_4_ * fVar117;
    auVar115._8_4_ = auVar248._8_4_ * fVar118;
    auVar115._12_4_ = auVar248._12_4_ * fVar119;
    auVar115._16_4_ = auVar248._16_4_ * 0.0;
    auVar115._20_4_ = auVar248._20_4_ * 0.0;
    auVar115._28_36_ = auVar233._28_36_;
    auVar115._24_4_ = auVar248._24_4_ * 0.0;
    auVar243._0_4_ = auVar253._0_4_ * fVar95;
    auVar243._4_4_ = auVar253._4_4_ * fVar117;
    auVar243._8_4_ = auVar253._8_4_ * fVar118;
    auVar243._12_4_ = auVar253._12_4_ * fVar119;
    auVar243._16_4_ = auVar253._16_4_ * 0.0;
    auVar243._20_4_ = auVar253._20_4_ * 0.0;
    auVar243._28_36_ = auVar230._28_36_;
    auVar243._24_4_ = auVar253._24_4_ * 0.0;
    auVar230._0_4_ = auVar218._0_4_ * fVar95;
    auVar230._4_4_ = auVar218._4_4_ * fVar117;
    auVar230._8_4_ = auVar218._8_4_ * fVar118;
    auVar230._12_4_ = auVar218._12_4_ * fVar119;
    auVar230._16_4_ = auVar218._16_4_ * 0.0;
    auVar230._20_4_ = auVar218._20_4_ * 0.0;
    auVar230._28_36_ = auVar218._28_36_;
    auVar230._24_4_ = auVar218._24_4_ * 0.0;
    auVar124 = vfmadd231ps_fma(auVar244._0_32_,auVar83,auVar224._0_32_);
    auVar56._8_8_ = uStack_1d8;
    auVar56._0_8_ = local_1e0;
    auVar56._16_8_ = uStack_1d0;
    auVar56._24_8_ = uStack_1c8;
    auVar79 = vfmadd231ps_fma(auVar115._0_32_,auVar83,auVar56);
    auVar7 = vfmadd231ps_fma(auVar243._0_32_,auVar83,auVar258._0_32_);
    auVar170 = vfmadd231ps_fma(auVar230._0_32_,auVar83,local_6a0);
    auVar233._0_4_ = local_2e0._0_4_ * fVar95;
    auVar233._4_4_ = local_2e0._4_4_ * fVar117;
    auVar233._8_4_ = local_2e0._8_4_ * fVar118;
    auVar233._12_4_ = local_2e0._12_4_ * fVar119;
    auVar233._16_4_ = local_2e0._16_4_ * 0.0;
    auVar233._20_4_ = local_2e0._20_4_ * 0.0;
    auVar233._28_36_ = auVar224._28_36_;
    auVar233._24_4_ = local_2e0._24_4_ * 0.0;
    auVar133._4_4_ = fVar117 * fStack_2fc;
    auVar133._0_4_ = fVar95 * local_300;
    auVar133._8_4_ = fVar118 * fStack_2f8;
    auVar133._12_4_ = fVar119 * fStack_2f4;
    auVar133._16_4_ = fStack_2f0 * 0.0;
    auVar133._20_4_ = fStack_2ec * 0.0;
    auVar133._24_4_ = fStack_2e8 * 0.0;
    auVar133._28_4_ = local_2e0._28_4_;
    auVar57._4_4_ = fVar117 * fStack_31c;
    auVar57._0_4_ = fVar95 * local_320;
    auVar57._8_4_ = fVar118 * fStack_318;
    auVar57._12_4_ = fVar119 * fStack_314;
    auVar57._16_4_ = fStack_310 * 0.0;
    auVar57._20_4_ = fStack_30c * 0.0;
    auVar57._24_4_ = fStack_308 * 0.0;
    auVar57._28_4_ = DAT_01faff20._28_4_;
    auVar55._8_8_ = uStack_1f8;
    auVar55._0_8_ = local_200;
    auVar55._16_8_ = uStack_1f0;
    auVar55._24_8_ = uStack_1e8;
    auVar132._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar117;
    auVar132._0_4_ = (float)local_200 * fVar95;
    auVar132._8_4_ = (float)uStack_1f8 * fVar118;
    auVar132._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar119;
    auVar132._16_4_ = (float)uStack_1f0 * 0.0;
    auVar132._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar132._24_4_ = (float)uStack_1e8 * 0.0;
    auVar132._28_4_ = local_6a0._28_4_;
    auVar191 = vfmadd231ps_fma(auVar233._0_32_,auVar83,local_2c0);
    auVar8 = vfmadd231ps_fma(auVar133,auVar83,auVar248._0_32_);
    auVar72 = vfmadd231ps_fma(auVar57,auVar83,auVar253._0_32_);
    auVar71 = vfmadd231ps_fma(auVar132,auVar83,auVar218._0_32_);
    auVar258._0_4_ = fVar95 * local_2a0;
    auVar258._4_4_ = fVar117 * fStack_29c;
    auVar258._8_4_ = fVar118 * fStack_298;
    auVar258._12_4_ = fVar119 * fStack_294;
    auVar258._16_4_ = fStack_290 * 0.0;
    auVar258._20_4_ = fStack_28c * 0.0;
    auVar258._28_36_ = auVar253._28_36_;
    auVar258._24_4_ = fStack_288 * 0.0;
    auVar224._0_4_ = fVar95 * (float)local_220;
    auVar224._4_4_ = fVar117 * local_220._4_4_;
    auVar224._8_4_ = fVar118 * (float)uStack_218;
    auVar224._12_4_ = fVar119 * uStack_218._4_4_;
    auVar224._16_4_ = (float)uStack_210 * 0.0;
    auVar224._20_4_ = uStack_210._4_4_ * 0.0;
    auVar224._28_36_ = auVar248._28_36_;
    auVar224._24_4_ = (float)uStack_208 * 0.0;
    auVar13._28_4_ = auVar218._28_4_;
    auVar13._0_28_ =
         ZEXT1628(CONCAT412(auVar191._12_4_ * fVar119,
                            CONCAT48(auVar191._8_4_ * fVar118,
                                     CONCAT44(auVar191._4_4_ * fVar117,auVar191._0_4_ * fVar95))));
    auVar124 = vfmadd231ps_fma(auVar13,auVar83,ZEXT1632(auVar124));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar119 * auVar8._12_4_,
                                                 CONCAT48(fVar118 * auVar8._8_4_,
                                                          CONCAT44(fVar117 * auVar8._4_4_,
                                                                   fVar95 * auVar8._0_4_)))),auVar83
                              ,ZEXT1632(auVar79));
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar119 * auVar72._12_4_,
                                                CONCAT48(fVar118 * auVar72._8_4_,
                                                         CONCAT44(fVar117 * auVar72._4_4_,
                                                                  fVar95 * auVar72._0_4_)))),auVar83
                             ,ZEXT1632(auVar7));
    auVar170 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar119,
                                                  CONCAT48(auVar71._8_4_ * fVar118,
                                                           CONCAT44(auVar71._4_4_ * fVar117,
                                                                    auVar71._0_4_ * fVar95)))),
                               auVar83,ZEXT1632(auVar170));
    auVar215._0_4_ = fVar95 * (float)local_240;
    auVar215._4_4_ = fVar117 * local_240._4_4_;
    auVar215._8_4_ = fVar118 * (float)uStack_238;
    auVar215._12_4_ = fVar119 * uStack_238._4_4_;
    auVar215._16_4_ = (float)uStack_230 * 0.0;
    auVar215._20_4_ = uStack_230._4_4_ * 0.0;
    auVar215._24_4_ = (float)uStack_228 * 0.0;
    auVar215._28_4_ = 0;
    auVar123 = vfmadd231ps_fma(auVar258._0_32_,auVar83,local_2e0);
    auVar191 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar123._12_4_ * fVar119,
                                                  CONCAT48(auVar123._8_4_ * fVar118,
                                                           CONCAT44(auVar123._4_4_ * fVar117,
                                                                    auVar123._0_4_ * fVar95)))),
                               auVar83,ZEXT1632(auVar191));
    auVar222._0_4_ = fVar95 * (float)local_260;
    auVar222._4_4_ = fVar117 * local_260._4_4_;
    auVar222._8_4_ = fVar118 * (float)uStack_258;
    auVar222._12_4_ = fVar119 * uStack_258._4_4_;
    auVar222._16_4_ = (float)uStack_250 * 0.0;
    auVar222._20_4_ = uStack_250._4_4_ * 0.0;
    auVar222._24_4_ = (float)uStack_248 * 0.0;
    auVar222._28_4_ = 0;
    auVar54._4_4_ = fStack_2fc;
    auVar54._0_4_ = local_300;
    auVar54._8_4_ = fStack_2f8;
    auVar54._12_4_ = fStack_2f4;
    auVar54._16_4_ = fStack_2f0;
    auVar54._20_4_ = fStack_2ec;
    auVar54._24_4_ = fStack_2e8;
    auVar54._28_4_ = fStack_2e4;
    auVar123 = vfmadd231ps_fma(auVar224._0_32_,auVar83,auVar54);
    auVar84._4_4_ = fStack_31c;
    auVar84._0_4_ = local_320;
    auVar84._8_4_ = fStack_318;
    auVar84._12_4_ = fStack_314;
    auVar84._16_4_ = fStack_310;
    auVar84._20_4_ = fStack_30c;
    auVar84._24_4_ = fStack_308;
    auVar84._28_4_ = fStack_304;
    auVar97 = vfmadd231ps_fma(auVar215,auVar83,auVar84);
    auVar70 = vfmadd231ps_fma(auVar222,auVar83,auVar55);
    auVar14._28_4_ = local_2e0._28_4_;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(auVar70._12_4_ * fVar119,
                            CONCAT48(auVar70._8_4_ * fVar118,
                                     CONCAT44(auVar70._4_4_ * fVar117,auVar70._0_4_ * fVar95))));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar123._12_4_ * fVar119,
                                                CONCAT48(auVar123._8_4_ * fVar118,
                                                         CONCAT44(auVar123._4_4_ * fVar117,
                                                                  auVar123._0_4_ * fVar95)))),
                             auVar83,ZEXT1632(auVar8));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar119 * auVar97._12_4_,
                                                 CONCAT48(fVar118 * auVar97._8_4_,
                                                          CONCAT44(fVar117 * auVar97._4_4_,
                                                                   fVar95 * auVar97._0_4_)))),
                              auVar83,ZEXT1632(auVar72));
    auVar71 = vfmadd231ps_fma(auVar14,auVar83,ZEXT1632(auVar71));
    auVar15._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(auVar8._12_4_ * fVar119,
                            CONCAT48(auVar8._8_4_ * fVar118,
                                     CONCAT44(auVar8._4_4_ * fVar117,auVar8._0_4_ * fVar95))));
    auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar191._12_4_ * fVar119,
                                                  CONCAT48(auVar191._8_4_ * fVar118,
                                                           CONCAT44(auVar191._4_4_ * fVar117,
                                                                    auVar191._0_4_ * fVar95)))),
                               auVar83,ZEXT1632(auVar124));
    auVar97 = vfmadd231ps_fma(auVar15,auVar83,ZEXT1632(auVar79));
    auVar84 = ZEXT1632(auVar97);
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar119 * auVar72._12_4_,
                                                 CONCAT48(fVar118 * auVar72._8_4_,
                                                          CONCAT44(fVar117 * auVar72._4_4_,
                                                                   fVar95 * auVar72._0_4_)))),
                              auVar83,ZEXT1632(auVar7));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar119,
                                                 CONCAT48(auVar71._8_4_ * fVar118,
                                                          CONCAT44(auVar71._4_4_ * fVar117,
                                                                   auVar71._0_4_ * fVar95)))),
                              ZEXT1632(auVar170),auVar83);
    auVar9 = vsubps_avx(ZEXT1632(auVar191),ZEXT1632(auVar124));
    auVar83 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar79));
    auVar240 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar7));
    auVar154 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar170));
    fVar184 = fVar122 * auVar9._0_4_ * 3.0;
    fVar202 = fVar122 * auVar9._4_4_ * 3.0;
    local_7c0._4_4_ = fVar202;
    local_7c0._0_4_ = fVar184;
    fVar203 = fVar122 * auVar9._8_4_ * 3.0;
    local_7c0._8_4_ = fVar203;
    fVar204 = fVar122 * auVar9._12_4_ * 3.0;
    local_7c0._12_4_ = fVar204;
    fVar205 = fVar122 * auVar9._16_4_ * 3.0;
    local_7c0._16_4_ = fVar205;
    fVar206 = fVar122 * auVar9._20_4_ * 3.0;
    local_7c0._20_4_ = fVar206;
    fVar207 = fVar122 * auVar9._24_4_ * 3.0;
    local_7c0._24_4_ = fVar207;
    local_7c0._28_4_ = 0x40400000;
    local_8e0._0_4_ = fVar122 * auVar83._0_4_ * 3.0;
    local_8e0._4_4_ = fVar122 * auVar83._4_4_ * 3.0;
    local_8e0._8_4_ = fVar122 * auVar83._8_4_ * 3.0;
    local_8e0._12_4_ = fVar122 * auVar83._12_4_ * 3.0;
    local_8e0._16_4_ = fVar122 * auVar83._16_4_ * 3.0;
    local_8e0._20_4_ = fVar122 * auVar83._20_4_ * 3.0;
    local_8e0._24_4_ = fVar122 * auVar83._24_4_ * 3.0;
    local_8e0._28_4_ = 0;
    local_5c0._0_4_ = fVar122 * auVar240._0_4_ * 3.0;
    local_5c0._4_4_ = fVar122 * auVar240._4_4_ * 3.0;
    local_5c0._8_4_ = fVar122 * auVar240._8_4_ * 3.0;
    local_5c0._12_4_ = fVar122 * auVar240._12_4_ * 3.0;
    local_5c0._16_4_ = fVar122 * auVar240._16_4_ * 3.0;
    local_5c0._20_4_ = fVar122 * auVar240._20_4_ * 3.0;
    local_5c0._24_4_ = fVar122 * auVar240._24_4_ * 3.0;
    local_5c0._28_4_ = 0;
    fVar95 = fVar122 * auVar154._0_4_ * 3.0;
    fVar117 = fVar122 * auVar154._4_4_ * 3.0;
    auVar156._4_4_ = fVar117;
    auVar156._0_4_ = fVar95;
    fVar118 = fVar122 * auVar154._8_4_ * 3.0;
    auVar156._8_4_ = fVar118;
    fVar119 = fVar122 * auVar154._12_4_ * 3.0;
    auVar156._12_4_ = fVar119;
    fVar120 = fVar122 * auVar154._16_4_ * 3.0;
    auVar156._16_4_ = fVar120;
    fVar121 = fVar122 * auVar154._20_4_ * 3.0;
    auVar156._20_4_ = fVar121;
    fVar122 = fVar122 * auVar154._24_4_ * 3.0;
    auVar156._24_4_ = fVar122;
    auVar156._28_4_ = auVar9._28_4_;
    local_a40 = ZEXT1632(auVar123);
    auVar132 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar123));
    local_780 = vpermps_avx2(_DAT_01fec480,auVar84);
    _local_7a0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar97));
    local_480 = vsubps_avx(auVar132,local_a40);
    local_580 = vsubps_avx(_local_7a0,ZEXT1632(auVar97));
    fVar139 = local_580._0_4_;
    fVar161 = local_580._4_4_;
    auVar155._4_4_ = fVar161 * fVar202;
    auVar155._0_4_ = fVar139 * fVar184;
    fVar184 = local_580._8_4_;
    auVar155._8_4_ = fVar184 * fVar203;
    fVar202 = local_580._12_4_;
    auVar155._12_4_ = fVar202 * fVar204;
    fVar203 = local_580._16_4_;
    auVar155._16_4_ = fVar203 * fVar205;
    fVar204 = local_580._20_4_;
    auVar155._20_4_ = fVar204 * fVar206;
    fVar205 = local_580._24_4_;
    auVar155._24_4_ = fVar205 * fVar207;
    auVar155._28_4_ = auVar132._28_4_;
    auVar124 = vfmsub231ps_fma(auVar155,local_5c0,local_480);
    local_4a0 = vsubps_avx(local_780,auVar84);
    fVar206 = local_480._0_4_;
    fVar207 = local_480._4_4_;
    auVar10._4_4_ = fVar207 * local_8e0._4_4_;
    auVar10._0_4_ = fVar206 * local_8e0._0_4_;
    fVar234 = local_480._8_4_;
    auVar10._8_4_ = fVar234 * local_8e0._8_4_;
    fVar235 = local_480._12_4_;
    auVar10._12_4_ = fVar235 * local_8e0._12_4_;
    fVar236 = local_480._16_4_;
    auVar10._16_4_ = fVar236 * local_8e0._16_4_;
    fVar237 = local_480._20_4_;
    auVar10._20_4_ = fVar237 * local_8e0._20_4_;
    fVar238 = local_480._24_4_;
    auVar10._24_4_ = fVar238 * local_8e0._24_4_;
    auVar10._28_4_ = local_780._28_4_;
    auVar79 = vfmsub231ps_fma(auVar10,local_7c0,local_4a0);
    auVar11._28_4_ = local_7a0._28_4_;
    auVar11._0_28_ =
         ZEXT1628(CONCAT412(auVar79._12_4_ * auVar79._12_4_,
                            CONCAT48(auVar79._8_4_ * auVar79._8_4_,
                                     CONCAT44(auVar79._4_4_ * auVar79._4_4_,
                                              auVar79._0_4_ * auVar79._0_4_))));
    auVar124 = vfmadd231ps_fma(auVar11,ZEXT1632(auVar124),ZEXT1632(auVar124));
    fVar162 = local_4a0._0_4_;
    auVar85._0_4_ = fVar162 * local_5c0._0_4_;
    fVar163 = local_4a0._4_4_;
    auVar85._4_4_ = fVar163 * local_5c0._4_4_;
    fVar164 = local_4a0._8_4_;
    auVar85._8_4_ = fVar164 * local_5c0._8_4_;
    fVar165 = local_4a0._12_4_;
    auVar85._12_4_ = fVar165 * local_5c0._12_4_;
    fVar166 = local_4a0._16_4_;
    auVar85._16_4_ = fVar166 * local_5c0._16_4_;
    fVar245 = local_4a0._20_4_;
    auVar85._20_4_ = fVar245 * local_5c0._20_4_;
    fVar246 = local_4a0._24_4_;
    auVar85._24_4_ = fVar246 * local_5c0._24_4_;
    auVar85._28_4_ = 0;
    auVar7 = vfmsub231ps_fma(auVar85,local_8e0,local_580);
    auVar129._0_4_ = fVar139 * fVar139;
    auVar129._4_4_ = fVar161 * fVar161;
    auVar129._8_4_ = fVar184 * fVar184;
    auVar129._12_4_ = fVar202 * fVar202;
    auVar129._16_4_ = fVar203 * fVar203;
    auVar129._20_4_ = fVar204 * fVar204;
    auVar129._24_4_ = fVar205 * fVar205;
    auVar129._28_4_ = 0;
    auVar79 = vfmadd231ps_fma(auVar129,local_4a0,local_4a0);
    auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),local_480,local_480);
    auVar83 = vrcpps_avx(ZEXT1632(auVar79));
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar124),ZEXT1632(auVar7),ZEXT1632(auVar7));
    auVar249._8_4_ = 0x3f800000;
    auVar249._0_8_ = 0x3f8000003f800000;
    auVar249._12_4_ = 0x3f800000;
    auVar249._16_4_ = 0x3f800000;
    auVar249._20_4_ = 0x3f800000;
    auVar249._24_4_ = 0x3f800000;
    auVar249._28_4_ = 0x3f800000;
    auVar124 = vfnmadd213ps_fma(auVar83,ZEXT1632(auVar79),auVar249);
    auVar124 = vfmadd132ps_fma(ZEXT1632(auVar124),auVar83,auVar83);
    local_a00 = vpermps_avx2(_DAT_01fec480,local_7c0);
    local_a20 = vpermps_avx2(_DAT_01fec480,local_5c0);
    auVar16._4_4_ = local_a00._4_4_ * fVar161;
    auVar16._0_4_ = local_a00._0_4_ * fVar139;
    auVar16._8_4_ = local_a00._8_4_ * fVar184;
    auVar16._12_4_ = local_a00._12_4_ * fVar202;
    auVar16._16_4_ = local_a00._16_4_ * fVar203;
    auVar16._20_4_ = local_a00._20_4_ * fVar204;
    auVar16._24_4_ = local_a00._24_4_ * fVar205;
    auVar16._28_4_ = auVar83._28_4_;
    auVar170 = vfmsub231ps_fma(auVar16,local_a20,local_480);
    local_820 = vpermps_avx2(_DAT_01fec480,local_8e0);
    auVar17._4_4_ = fVar207 * local_820._4_4_;
    auVar17._0_4_ = fVar206 * local_820._0_4_;
    auVar17._8_4_ = fVar234 * local_820._8_4_;
    auVar17._12_4_ = fVar235 * local_820._12_4_;
    auVar17._16_4_ = fVar236 * local_820._16_4_;
    auVar17._20_4_ = fVar237 * local_820._20_4_;
    auVar17._24_4_ = fVar238 * local_820._24_4_;
    auVar17._28_4_ = 0x40400000;
    auVar14 = local_a00;
    auVar191 = vfmsub231ps_fma(auVar17,local_a00,local_4a0);
    auVar170 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar191._12_4_ * auVar191._12_4_,
                                                  CONCAT48(auVar191._8_4_ * auVar191._8_4_,
                                                           CONCAT44(auVar191._4_4_ * auVar191._4_4_,
                                                                    auVar191._0_4_ * auVar191._0_4_)
                                                          ))),ZEXT1632(auVar170),ZEXT1632(auVar170))
    ;
    auVar13 = local_a20;
    auVar177._0_4_ = fVar162 * local_a20._0_4_;
    auVar177._4_4_ = fVar163 * local_a20._4_4_;
    auVar177._8_4_ = fVar164 * local_a20._8_4_;
    auVar177._12_4_ = fVar165 * local_a20._12_4_;
    auVar177._16_4_ = fVar166 * local_a20._16_4_;
    auVar177._20_4_ = fVar245 * local_a20._20_4_;
    auVar177._24_4_ = fVar246 * local_a20._24_4_;
    auVar177._28_4_ = 0;
    auVar15 = local_820;
    auVar191 = vfmsub231ps_fma(auVar177,local_820,local_580);
    auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),ZEXT1632(auVar191),ZEXT1632(auVar191));
    auVar83 = vmaxps_avx(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar124._12_4_,
                                            CONCAT48(auVar7._8_4_ * auVar124._8_4_,
                                                     CONCAT44(auVar7._4_4_ * auVar124._4_4_,
                                                              auVar7._0_4_ * auVar124._0_4_)))),
                         ZEXT1632(CONCAT412(auVar170._12_4_ * auVar124._12_4_,
                                            CONCAT48(auVar170._8_4_ * auVar124._8_4_,
                                                     CONCAT44(auVar170._4_4_ * auVar124._4_4_,
                                                              auVar170._0_4_ * auVar124._0_4_)))));
    local_640._0_4_ = auVar70._0_4_ + fVar95;
    local_640._4_4_ = auVar70._4_4_ + fVar117;
    local_640._8_4_ = auVar70._8_4_ + fVar118;
    local_640._12_4_ = auVar70._12_4_ + fVar119;
    local_640._16_4_ = fVar120 + 0.0;
    local_640._20_4_ = fVar121 + 0.0;
    local_640._24_4_ = fVar122 + 0.0;
    local_640._28_4_ = auVar9._28_4_ + 0.0;
    local_620 = ZEXT1632(auVar70);
    auVar9 = vsubps_avx(local_620,auVar156);
    _local_860 = vpermps_avx2(_DAT_01fec480,auVar9);
    _local_6c0 = vpermps_avx2(_DAT_01fec480,local_620);
    auVar9 = vmaxps_avx(local_620,local_640);
    auVar240 = vmaxps_avx(_local_860,_local_6c0);
    auVar154 = vrsqrtps_avx(ZEXT1632(auVar79));
    auVar9 = vmaxps_avx(auVar9,auVar240);
    fVar95 = auVar154._0_4_;
    fVar117 = auVar154._4_4_;
    fVar118 = auVar154._8_4_;
    fVar119 = auVar154._12_4_;
    fVar122 = auVar154._16_4_;
    fVar120 = auVar154._20_4_;
    fVar121 = auVar154._24_4_;
    auVar18._4_4_ = fVar117 * fVar117 * fVar117 * auVar79._4_4_ * -0.5;
    auVar18._0_4_ = fVar95 * fVar95 * fVar95 * auVar79._0_4_ * -0.5;
    auVar18._8_4_ = fVar118 * fVar118 * fVar118 * auVar79._8_4_ * -0.5;
    auVar18._12_4_ = fVar119 * fVar119 * fVar119 * auVar79._12_4_ * -0.5;
    auVar18._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
    auVar18._20_4_ = fVar120 * fVar120 * fVar120 * -0.0;
    auVar18._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
    auVar18._28_4_ = 0;
    auVar86._8_4_ = 0x3fc00000;
    auVar86._0_8_ = 0x3fc000003fc00000;
    auVar86._12_4_ = 0x3fc00000;
    auVar86._16_4_ = 0x3fc00000;
    auVar86._20_4_ = 0x3fc00000;
    auVar86._24_4_ = 0x3fc00000;
    auVar86._28_4_ = 0x3fc00000;
    auVar124 = vfmadd231ps_fma(auVar18,auVar86,auVar154);
    fVar117 = auVar124._0_4_;
    fVar118 = auVar124._4_4_;
    auVar19._4_4_ = fVar163 * fVar118;
    auVar19._0_4_ = fVar162 * fVar117;
    fVar122 = auVar124._8_4_;
    auVar19._8_4_ = fVar164 * fVar122;
    fVar121 = auVar124._12_4_;
    auVar19._12_4_ = fVar165 * fVar121;
    auVar19._16_4_ = fVar166 * 0.0;
    auVar19._20_4_ = fVar245 * 0.0;
    auVar19._24_4_ = fVar246 * 0.0;
    auVar19._28_4_ = 0x3fc00000;
    auVar256._0_4_ = local_440 * fVar139 * fVar117;
    auVar256._4_4_ = fStack_43c * fVar161 * fVar118;
    auVar256._8_4_ = fStack_438 * fVar184 * fVar122;
    auVar256._12_4_ = fStack_434 * fVar202 * fVar121;
    auVar256._16_4_ = fStack_430 * fVar203 * 0.0;
    auVar256._20_4_ = fStack_42c * fVar204 * 0.0;
    auVar256._24_4_ = fStack_428 * fVar205 * 0.0;
    auVar256._28_4_ = 0;
    auVar79 = vfmadd231ps_fma(auVar256,auVar19,_local_680);
    local_460 = ZEXT1632(auVar97);
    local_840 = vsubps_avx(ZEXT832(0) << 0x20,local_460);
    fVar162 = local_840._0_4_;
    fVar163 = local_840._4_4_;
    auVar20._4_4_ = fVar163 * fVar161 * fVar118;
    auVar20._0_4_ = fVar162 * fVar139 * fVar117;
    fVar139 = local_840._8_4_;
    auVar20._8_4_ = fVar139 * fVar184 * fVar122;
    fVar161 = local_840._12_4_;
    auVar20._12_4_ = fVar161 * fVar202 * fVar121;
    fVar164 = local_840._16_4_;
    auVar20._16_4_ = fVar164 * fVar203 * 0.0;
    fVar165 = local_840._20_4_;
    auVar20._20_4_ = fVar165 * fVar204 * 0.0;
    fVar166 = local_840._24_4_;
    auVar20._24_4_ = fVar166 * fVar205 * 0.0;
    auVar20._28_4_ = local_580._28_4_;
    auVar240 = vsubps_avx(ZEXT832(0) << 0x20,auVar84);
    auVar7 = vfmadd231ps_fma(auVar20,auVar240,auVar19);
    auVar21._4_4_ = fVar207 * fVar118;
    auVar21._0_4_ = fVar206 * fVar117;
    auVar21._8_4_ = fVar234 * fVar122;
    auVar21._12_4_ = fVar235 * fVar121;
    auVar21._16_4_ = fVar236 * 0.0;
    auVar21._20_4_ = fVar237 * 0.0;
    auVar21._24_4_ = fVar238 * 0.0;
    auVar21._28_4_ = 0x3fc00000;
    auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar21,_local_660);
    auVar154 = vsubps_avx(ZEXT832(0) << 0x20,local_a40);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar154,auVar21);
    auVar22._4_4_ = fVar163 * fStack_43c;
    auVar22._0_4_ = fVar162 * local_440;
    auVar22._8_4_ = fVar139 * fStack_438;
    auVar22._12_4_ = fVar161 * fStack_434;
    auVar22._16_4_ = fVar164 * fStack_430;
    auVar22._20_4_ = fVar165 * fStack_42c;
    auVar22._24_4_ = fVar166 * fStack_428;
    auVar22._28_4_ = 0x3fc00000;
    auVar170 = vfmadd231ps_fma(auVar22,_local_680,auVar240);
    auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),_local_660,auVar154);
    fVar95 = auVar7._0_4_;
    fVar206 = auVar79._0_4_;
    fVar119 = auVar7._4_4_;
    fVar207 = auVar79._4_4_;
    fVar120 = auVar7._8_4_;
    fVar234 = auVar79._8_4_;
    fVar184 = auVar7._12_4_;
    fVar235 = auVar79._12_4_;
    auVar133 = vsubps_avx(ZEXT1632(auVar170),
                          ZEXT1632(CONCAT412(fVar235 * fVar184,
                                             CONCAT48(fVar234 * fVar120,
                                                      CONCAT44(fVar207 * fVar119,fVar206 * fVar95)))
                                  ));
    auVar23._4_4_ = fVar163 * fVar163;
    auVar23._0_4_ = fVar162 * fVar162;
    auVar23._8_4_ = fVar139 * fVar139;
    auVar23._12_4_ = fVar161 * fVar161;
    auVar23._16_4_ = fVar164 * fVar164;
    auVar23._20_4_ = fVar165 * fVar165;
    auVar23._24_4_ = fVar166 * fVar166;
    auVar23._28_4_ = 0;
    auVar170 = vfmadd231ps_fma(auVar23,auVar240,auVar240);
    auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar154,auVar154);
    auVar24._28_4_ = fStack_424;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar184 * fVar184,
                            CONCAT48(fVar120 * fVar120,CONCAT44(fVar119 * fVar119,fVar95 * fVar95)))
                 );
    local_700 = vsubps_avx(ZEXT1632(auVar170),auVar24);
    _local_540 = vsqrtps_avx(auVar83);
    fVar205 = local_540._28_4_ + auVar9._28_4_;
    fVar95 = (local_540._0_4_ + auVar9._0_4_) * 1.0000002;
    fVar119 = (local_540._4_4_ + auVar9._4_4_) * 1.0000002;
    fVar120 = (local_540._8_4_ + auVar9._8_4_) * 1.0000002;
    fVar184 = (local_540._12_4_ + auVar9._12_4_) * 1.0000002;
    fVar202 = (local_540._16_4_ + auVar9._16_4_) * 1.0000002;
    fVar203 = (local_540._20_4_ + auVar9._20_4_) * 1.0000002;
    fVar204 = (local_540._24_4_ + auVar9._24_4_) * 1.0000002;
    auVar25._4_4_ = fVar119 * fVar119;
    auVar25._0_4_ = fVar95 * fVar95;
    auVar25._8_4_ = fVar120 * fVar120;
    auVar25._12_4_ = fVar184 * fVar184;
    auVar25._16_4_ = fVar202 * fVar202;
    auVar25._20_4_ = fVar203 * fVar203;
    auVar25._24_4_ = fVar204 * fVar204;
    auVar25._28_4_ = fVar205;
    auVar228._0_4_ = auVar133._0_4_ + auVar133._0_4_;
    auVar228._4_4_ = auVar133._4_4_ + auVar133._4_4_;
    auVar228._8_4_ = auVar133._8_4_ + auVar133._8_4_;
    auVar228._12_4_ = auVar133._12_4_ + auVar133._12_4_;
    auVar228._16_4_ = auVar133._16_4_ + auVar133._16_4_;
    auVar228._20_4_ = auVar133._20_4_ + auVar133._20_4_;
    auVar228._24_4_ = auVar133._24_4_ + auVar133._24_4_;
    auVar228._28_4_ = auVar133._28_4_ + auVar133._28_4_;
    auVar9 = vsubps_avx(local_700,auVar25);
    auVar257 = ZEXT1632(auVar79);
    local_800._28_4_ = fStack_424;
    local_800._0_28_ =
         ZEXT1628(CONCAT412(fVar235 * fVar235,
                            CONCAT48(fVar234 * fVar234,CONCAT44(fVar207 * fVar207,fVar206 * fVar206)
                                    )));
    local_560 = vsubps_avx(local_280,local_800);
    local_720._4_4_ = auVar228._4_4_ * auVar228._4_4_;
    local_720._0_4_ = auVar228._0_4_ * auVar228._0_4_;
    local_720._8_4_ = auVar228._8_4_ * auVar228._8_4_;
    local_720._12_4_ = auVar228._12_4_ * auVar228._12_4_;
    local_720._16_4_ = auVar228._16_4_ * auVar228._16_4_;
    local_720._20_4_ = auVar228._20_4_ * auVar228._20_4_;
    local_720._24_4_ = auVar228._24_4_ * auVar228._24_4_;
    local_720._28_4_ = fVar205;
    fVar184 = local_560._0_4_;
    fVar119 = fVar184 * 4.0;
    fVar202 = local_560._4_4_;
    fVar120 = fVar202 * 4.0;
    fVar203 = local_560._8_4_;
    fStack_878 = fVar203 * 4.0;
    fVar204 = local_560._12_4_;
    fStack_874 = fVar204 * 4.0;
    fVar205 = local_560._16_4_;
    fStack_870 = fVar205 * 4.0;
    fVar206 = local_560._20_4_;
    fStack_86c = fVar206 * 4.0;
    fVar207 = local_560._24_4_;
    fStack_868 = fVar207 * 4.0;
    local_880 = CONCAT44(fVar120,fVar119);
    uStack_864 = 0x40800000;
    auVar26._4_4_ = fVar120 * auVar9._4_4_;
    auVar26._0_4_ = fVar119 * auVar9._0_4_;
    auVar26._8_4_ = fStack_878 * auVar9._8_4_;
    auVar26._12_4_ = fStack_874 * auVar9._12_4_;
    auVar26._16_4_ = fStack_870 * auVar9._16_4_;
    auVar26._20_4_ = fStack_86c * auVar9._20_4_;
    auVar26._24_4_ = fStack_868 * auVar9._24_4_;
    auVar26._28_4_ = 0x40800000;
    auVar133 = vsubps_avx(local_720,auVar26);
    auVar83 = vcmpps_avx(auVar133,ZEXT432(0) << 0x20,5);
    _local_520 = ZEXT1632(auVar7);
    fVar95 = local_560._28_4_;
    if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar83 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar83 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar83 >> 0x7f,0) == '\0') &&
          (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar83 >> 0xbf,0) == '\0') &&
        (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar83[0x1f]) {
      auVar259._8_4_ = 0x7f800000;
      auVar259._0_8_ = 0x7f8000007f800000;
      auVar259._12_4_ = 0x7f800000;
      auVar259._16_4_ = 0x7f800000;
      auVar259._20_4_ = 0x7f800000;
      auVar259._24_4_ = 0x7f800000;
      auVar259._28_4_ = 0x7f800000;
      auVar178._8_4_ = 0xff800000;
      auVar178._0_8_ = 0xff800000ff800000;
      auVar178._12_4_ = 0xff800000;
      auVar178._16_4_ = 0xff800000;
      auVar178._20_4_ = 0xff800000;
      auVar178._24_4_ = 0xff800000;
      auVar178._28_4_ = 0xff800000;
      auVar257 = auVar228;
    }
    else {
      auVar10 = vsqrtps_avx(auVar133);
      auVar260._0_4_ = fVar184 + fVar184;
      auVar260._4_4_ = fVar202 + fVar202;
      auVar260._8_4_ = fVar203 + fVar203;
      auVar260._12_4_ = fVar204 + fVar204;
      auVar260._16_4_ = fVar205 + fVar205;
      auVar260._20_4_ = fVar206 + fVar206;
      auVar260._24_4_ = fVar207 + fVar207;
      auVar260._28_4_ = fVar95 + fVar95;
      auVar155 = vrcpps_avx(auVar260);
      auVar156 = vcmpps_avx(auVar133,ZEXT832(0) << 0x20,5);
      auVar179._8_4_ = 0x3f800000;
      auVar179._0_8_ = 0x3f8000003f800000;
      auVar179._12_4_ = 0x3f800000;
      auVar179._16_4_ = 0x3f800000;
      auVar179._20_4_ = 0x3f800000;
      auVar179._24_4_ = 0x3f800000;
      auVar179._28_4_ = 0x3f800000;
      auVar7 = vfnmadd213ps_fma(auVar260,auVar155,auVar179);
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar155,auVar155);
      auVar180._0_4_ = (uint)auVar228._0_4_ ^ local_4c0;
      auVar180._4_4_ = (uint)auVar228._4_4_ ^ uStack_4bc;
      auVar180._8_4_ = (uint)auVar228._8_4_ ^ uStack_4b8;
      auVar180._12_4_ = (uint)auVar228._12_4_ ^ uStack_4b4;
      auVar180._16_4_ = (uint)auVar228._16_4_ ^ (uint)fStack_4b0;
      auVar180._20_4_ = (uint)auVar228._20_4_ ^ (uint)fStack_4ac;
      auVar180._24_4_ = (uint)auVar228._24_4_ ^ (uint)fStack_4a8;
      auVar180._28_4_ = (uint)auVar228._28_4_ ^ uStack_4a4;
      auVar11 = vsubps_avx(auVar180,auVar10);
      auVar27._4_4_ = auVar7._4_4_ * auVar11._4_4_;
      auVar27._0_4_ = auVar7._0_4_ * auVar11._0_4_;
      auVar27._8_4_ = auVar7._8_4_ * auVar11._8_4_;
      auVar27._12_4_ = auVar7._12_4_ * auVar11._12_4_;
      auVar27._16_4_ = auVar11._16_4_ * 0.0;
      auVar27._20_4_ = auVar11._20_4_ * 0.0;
      auVar27._24_4_ = auVar11._24_4_ * 0.0;
      auVar27._28_4_ = auVar11._28_4_;
      local_740 = auVar228;
      auVar133 = vsubps_avx(auVar10,auVar228);
      auVar28._4_4_ = auVar7._4_4_ * auVar133._4_4_;
      auVar28._0_4_ = auVar7._0_4_ * auVar133._0_4_;
      auVar28._8_4_ = auVar7._8_4_ * auVar133._8_4_;
      auVar28._12_4_ = auVar7._12_4_ * auVar133._12_4_;
      auVar28._16_4_ = auVar133._16_4_ * 0.0;
      auVar28._20_4_ = auVar133._20_4_ * 0.0;
      auVar28._24_4_ = auVar133._24_4_ * 0.0;
      auVar28._28_4_ = auVar155._28_4_;
      auVar7 = vfmadd213ps_fma(auVar257,auVar27,_local_520);
      local_4e0 = ZEXT1632(CONCAT412(fVar121 * auVar7._12_4_,
                                     CONCAT48(fVar122 * auVar7._8_4_,
                                              CONCAT44(fVar118 * auVar7._4_4_,fVar117 * auVar7._0_4_
                                                      ))));
      auVar49._4_4_ = uStack_6dc;
      auVar49._0_4_ = local_6e0;
      auVar49._8_4_ = uStack_6d8;
      auVar49._12_4_ = uStack_6d4;
      auVar49._16_4_ = uStack_6d0;
      auVar49._20_4_ = uStack_6cc;
      auVar49._24_4_ = uStack_6c8;
      auVar49._28_4_ = uStack_6c4;
      auVar133 = vandps_avx(auVar49,local_800);
      auVar133 = vmaxps_avx(local_360,auVar133);
      auVar29._4_4_ = auVar133._4_4_ * 1.9073486e-06;
      auVar29._0_4_ = auVar133._0_4_ * 1.9073486e-06;
      auVar29._8_4_ = auVar133._8_4_ * 1.9073486e-06;
      auVar29._12_4_ = auVar133._12_4_ * 1.9073486e-06;
      auVar29._16_4_ = auVar133._16_4_ * 1.9073486e-06;
      auVar29._20_4_ = auVar133._20_4_ * 1.9073486e-06;
      auVar29._24_4_ = auVar133._24_4_ * 1.9073486e-06;
      auVar29._28_4_ = auVar133._28_4_;
      auVar133 = vandps_avx(local_560,auVar49);
      auVar133 = vcmpps_avx(auVar133,auVar29,1);
      auVar7 = vfmadd213ps_fma(auVar257,auVar28,_local_520);
      auVar261._8_4_ = 0x7f800000;
      auVar261._0_8_ = 0x7f8000007f800000;
      auVar261._12_4_ = 0x7f800000;
      auVar261._16_4_ = 0x7f800000;
      auVar261._20_4_ = 0x7f800000;
      auVar261._24_4_ = 0x7f800000;
      auVar261._28_4_ = 0x7f800000;
      auVar259 = vblendvps_avx(auVar261,auVar27,auVar156);
      _local_500 = ZEXT1628(CONCAT412(auVar7._12_4_ * fVar121,
                                      CONCAT48(auVar7._8_4_ * fVar122,
                                               CONCAT44(auVar7._4_4_ * fVar118,
                                                        auVar7._0_4_ * fVar117))));
      uStack_4e4 = auVar11._28_4_;
      auVar181._8_4_ = 0xff800000;
      auVar181._0_8_ = 0xff800000ff800000;
      auVar181._12_4_ = 0xff800000;
      auVar181._16_4_ = 0xff800000;
      auVar181._20_4_ = 0xff800000;
      auVar181._24_4_ = 0xff800000;
      auVar181._28_4_ = 0xff800000;
      auVar178 = vblendvps_avx(auVar181,auVar28,auVar156);
      auVar155 = auVar156 & auVar133;
      if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar155 >> 0x7f,0) != '\0') ||
            (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar155 >> 0xbf,0) != '\0') ||
          (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar155[0x1f] < '\0') {
        auVar83 = vandps_avx(auVar133,auVar156);
        auVar133 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,2);
        auVar217._8_4_ = 0xff800000;
        auVar217._0_8_ = 0xff800000ff800000;
        auVar217._12_4_ = 0xff800000;
        auVar217._16_4_ = 0xff800000;
        auVar217._20_4_ = 0xff800000;
        auVar217._24_4_ = 0xff800000;
        auVar217._28_4_ = 0xff800000;
        auVar251._8_4_ = 0x7f800000;
        auVar251._0_8_ = 0x7f8000007f800000;
        auVar251._12_4_ = 0x7f800000;
        auVar251._16_4_ = 0x7f800000;
        auVar251._20_4_ = 0x7f800000;
        auVar251._24_4_ = 0x7f800000;
        auVar251._28_4_ = 0x7f800000;
        auVar9 = vblendvps_avx(auVar251,auVar217,auVar133);
        auVar7 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
        auVar155 = vpmovsxwd_avx2(auVar7);
        auVar259 = vblendvps_avx(auVar259,auVar9,auVar155);
        auVar9 = vblendvps_avx(auVar217,auVar251,auVar133);
        auVar178 = vblendvps_avx(auVar178,auVar9,auVar155);
        auVar93._0_8_ = auVar83._0_8_ ^ 0xffffffffffffffff;
        auVar93._8_4_ = auVar83._8_4_ ^ 0xffffffff;
        auVar93._12_4_ = auVar83._12_4_ ^ 0xffffffff;
        auVar93._16_4_ = auVar83._16_4_ ^ 0xffffffff;
        auVar93._20_4_ = auVar83._20_4_ ^ 0xffffffff;
        auVar93._24_4_ = auVar83._24_4_ ^ 0xffffffff;
        auVar93._28_4_ = auVar83._28_4_ ^ 0xffffffff;
        auVar83 = vorps_avx(auVar133,auVar93);
        auVar83 = vandps_avx(auVar156,auVar83);
      }
    }
    auVar9 = local_340 & auVar83;
    local_3a0 = _local_680;
    local_880 = uVar59;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar9 >> 0x7f,0) == '\0') &&
          (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar9 >> 0xbf,0) == '\0') &&
        (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar9[0x1f]) {
LAB_0162e168:
      auVar233 = ZEXT3264(local_3a0);
      auVar230 = ZEXT3264(auVar257);
      auVar243 = ZEXT3264(auVar154);
      auVar258 = ZEXT3264(local_980);
      auVar248 = ZEXT3264(local_9a0);
      auVar253 = ZEXT3264(local_9c0);
      auVar218 = ZEXT3264(local_9e0);
      auVar224 = ZEXT3264(local_900);
    }
    else {
      local_740 = ZEXT1632(auVar124);
      fVar234 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_750._0_4_;
      auVar87._4_4_ = fVar234;
      auVar87._0_4_ = fVar234;
      auVar87._8_4_ = fVar234;
      auVar87._12_4_ = fVar234;
      auVar87._16_4_ = fVar234;
      auVar87._20_4_ = fVar234;
      auVar87._24_4_ = fVar234;
      auVar87._28_4_ = fVar234;
      auVar133 = vmaxps_avx(auVar87,auVar259);
      fVar234 = (ray->super_RayK<1>).tfar - (float)local_750._0_4_;
      auVar195._4_4_ = fVar234;
      auVar195._0_4_ = fVar234;
      auVar195._8_4_ = fVar234;
      auVar195._12_4_ = fVar234;
      auVar195._16_4_ = fVar234;
      auVar195._20_4_ = fVar234;
      auVar195._24_4_ = fVar234;
      auVar195._28_4_ = fVar234;
      auVar156 = vminps_avx(auVar195,auVar178);
      auVar130._0_4_ = local_5c0._0_4_ * fVar162;
      auVar130._4_4_ = local_5c0._4_4_ * fVar163;
      auVar130._8_4_ = local_5c0._8_4_ * fVar139;
      auVar130._12_4_ = local_5c0._12_4_ * fVar161;
      auVar130._16_4_ = local_5c0._16_4_ * fVar164;
      auVar130._20_4_ = local_5c0._20_4_ * fVar165;
      auVar130._24_4_ = local_5c0._24_4_ * fVar166;
      auVar130._28_4_ = 0;
      auVar124 = vfmadd213ps_fma(auVar240,local_8e0,auVar130);
      auVar7 = vfmadd213ps_fma(auVar154,local_7c0,ZEXT1632(auVar124));
      auVar257._4_4_ = fStack_43c;
      auVar257._0_4_ = local_440;
      auVar257._8_4_ = fStack_438;
      auVar257._12_4_ = fStack_434;
      auVar257._16_4_ = fStack_430;
      auVar257._20_4_ = fStack_42c;
      auVar257._24_4_ = fStack_428;
      auVar257._28_4_ = fStack_424;
      auVar153._0_4_ = local_440 * local_5c0._0_4_;
      auVar153._4_4_ = fStack_43c * local_5c0._4_4_;
      auVar153._8_4_ = fStack_438 * local_5c0._8_4_;
      auVar153._12_4_ = fStack_434 * local_5c0._12_4_;
      auVar153._16_4_ = fStack_430 * local_5c0._16_4_;
      auVar153._20_4_ = fStack_42c * local_5c0._20_4_;
      auVar153._24_4_ = fStack_428 * local_5c0._24_4_;
      auVar153._28_4_ = 0;
      auVar124 = vfmadd231ps_fma(auVar153,_local_680,local_8e0);
      auVar170 = vfmadd231ps_fma(ZEXT1632(auVar124),_local_660,local_7c0);
      auVar50._4_4_ = uStack_6dc;
      auVar50._0_4_ = local_6e0;
      auVar50._8_4_ = uStack_6d8;
      auVar50._12_4_ = uStack_6d4;
      auVar50._16_4_ = uStack_6d0;
      auVar50._20_4_ = uStack_6cc;
      auVar50._24_4_ = uStack_6c8;
      auVar50._28_4_ = uStack_6c4;
      auVar9 = vandps_avx(auVar50,ZEXT1632(auVar170));
      auVar196._8_4_ = 0x219392ef;
      auVar196._0_8_ = 0x219392ef219392ef;
      auVar196._12_4_ = 0x219392ef;
      auVar196._16_4_ = 0x219392ef;
      auVar196._20_4_ = 0x219392ef;
      auVar196._24_4_ = 0x219392ef;
      auVar196._28_4_ = 0x219392ef;
      auVar240 = vcmpps_avx(auVar9,auVar196,1);
      auVar9 = vrcpps_avx(ZEXT1632(auVar170));
      auVar216._8_4_ = 0x3f800000;
      auVar216._0_8_ = 0x3f8000003f800000;
      auVar216._12_4_ = 0x3f800000;
      auVar216._16_4_ = 0x3f800000;
      auVar216._20_4_ = 0x3f800000;
      auVar216._24_4_ = 0x3f800000;
      auVar216._28_4_ = 0x3f800000;
      auVar154 = ZEXT1632(auVar170);
      auVar124 = vfnmadd213ps_fma(auVar9,auVar154,auVar216);
      auVar124 = vfmadd132ps_fma(ZEXT1632(auVar124),auVar9,auVar9);
      auVar241._0_4_ = local_4c0 ^ auVar170._0_4_;
      auVar241._4_4_ = uStack_4bc ^ auVar170._4_4_;
      auVar241._8_4_ = uStack_4b8 ^ auVar170._8_4_;
      auVar241._12_4_ = uStack_4b4 ^ auVar170._12_4_;
      auVar241._16_4_ = fStack_4b0;
      auVar241._20_4_ = fStack_4ac;
      auVar241._24_4_ = fStack_4a8;
      auVar241._28_4_ = uStack_4a4;
      auVar30._4_4_ = auVar124._4_4_ * (float)(auVar7._4_4_ ^ uStack_4bc);
      auVar30._0_4_ = auVar124._0_4_ * (float)(auVar7._0_4_ ^ local_4c0);
      auVar30._8_4_ = auVar124._8_4_ * (float)(auVar7._8_4_ ^ uStack_4b8);
      auVar30._12_4_ = auVar124._12_4_ * (float)(auVar7._12_4_ ^ uStack_4b4);
      auVar30._16_4_ = fStack_4b0 * 0.0;
      auVar30._20_4_ = fStack_4ac * 0.0;
      auVar30._24_4_ = fStack_4a8 * 0.0;
      auVar30._28_4_ = uStack_4a4;
      auVar9 = vcmpps_avx(auVar154,auVar241,1);
      auVar9 = vorps_avx(auVar240,auVar9);
      auVar250._8_4_ = 0xff800000;
      auVar250._0_8_ = 0xff800000ff800000;
      auVar250._12_4_ = 0xff800000;
      auVar250._16_4_ = 0xff800000;
      auVar250._20_4_ = 0xff800000;
      auVar250._24_4_ = 0xff800000;
      auVar250._28_4_ = 0xff800000;
      auVar9 = vblendvps_avx(auVar30,auVar250,auVar9);
      auVar133 = vmaxps_avx(auVar133,auVar9);
      auVar9 = vcmpps_avx(auVar154,auVar241,6);
      auVar9 = vorps_avx(auVar240,auVar9);
      auVar154._8_4_ = 0x7f800000;
      auVar154._0_8_ = 0x7f8000007f800000;
      auVar154._12_4_ = 0x7f800000;
      auVar154._16_4_ = 0x7f800000;
      auVar154._20_4_ = 0x7f800000;
      auVar154._24_4_ = 0x7f800000;
      auVar154._28_4_ = 0x7f800000;
      auVar9 = vblendvps_avx(auVar30,auVar154,auVar9);
      auVar156 = vminps_avx(auVar156,auVar9);
      fVar139 = (float)(local_4c0 ^ (uint)local_a20._0_4_);
      fVar161 = (float)(uStack_4bc ^ (uint)local_a20._4_4_);
      fVar162 = (float)(uStack_4b8 ^ (uint)local_a20._8_4_);
      fVar163 = (float)(uStack_4b4 ^ (uint)local_a20._12_4_);
      fVar164 = (float)((uint)fStack_4b0 ^ (uint)local_a20._16_4_);
      fVar165 = (float)((uint)fStack_4ac ^ (uint)local_a20._20_4_);
      fVar166 = (float)((uint)fStack_4a8 ^ (uint)local_a20._24_4_);
      auVar182._0_4_ = local_4c0 ^ (uint)local_820._0_4_;
      auVar182._4_4_ = uStack_4bc ^ (uint)local_820._4_4_;
      auVar182._8_4_ = uStack_4b8 ^ (uint)local_820._8_4_;
      auVar182._12_4_ = uStack_4b4 ^ (uint)local_820._12_4_;
      auVar182._16_4_ = (uint)fStack_4b0 ^ (uint)local_820._16_4_;
      auVar182._20_4_ = (uint)fStack_4ac ^ (uint)local_820._20_4_;
      auVar182._24_4_ = (uint)fStack_4a8 ^ (uint)local_820._24_4_;
      auVar182._28_4_ = uStack_4a4 ^ local_820._28_4_;
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_780);
      auVar240 = vsubps_avx(ZEXT832(0) << 0x20,_local_7a0);
      auVar31._4_4_ = auVar240._4_4_ * fVar161;
      auVar31._0_4_ = auVar240._0_4_ * fVar139;
      auVar31._8_4_ = auVar240._8_4_ * fVar162;
      auVar31._12_4_ = auVar240._12_4_ * fVar163;
      auVar31._16_4_ = auVar240._16_4_ * fVar164;
      auVar31._20_4_ = auVar240._20_4_ * fVar165;
      auVar31._24_4_ = auVar240._24_4_ * fVar166;
      auVar31._28_4_ = auVar240._28_4_;
      auVar124 = vfmadd231ps_fma(auVar31,auVar182,auVar9);
      auVar197._0_4_ = local_4c0 ^ (uint)local_a00._0_4_;
      auVar197._4_4_ = uStack_4bc ^ (uint)local_a00._4_4_;
      auVar197._8_4_ = uStack_4b8 ^ (uint)local_a00._8_4_;
      auVar197._12_4_ = uStack_4b4 ^ (uint)local_a00._12_4_;
      auVar197._16_4_ = (uint)fStack_4b0 ^ (uint)local_a00._16_4_;
      auVar197._20_4_ = (uint)fStack_4ac ^ (uint)local_a00._20_4_;
      auVar197._24_4_ = (uint)fStack_4a8 ^ (uint)local_a00._24_4_;
      auVar197._28_4_ = uStack_4a4 ^ local_a00._28_4_;
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,auVar132);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar197,auVar9);
      auVar32._4_4_ = fStack_43c * fVar161;
      auVar32._0_4_ = local_440 * fVar139;
      auVar32._8_4_ = fStack_438 * fVar162;
      auVar32._12_4_ = fStack_434 * fVar163;
      auVar32._16_4_ = fStack_430 * fVar164;
      auVar32._20_4_ = fStack_42c * fVar165;
      auVar32._24_4_ = fStack_428 * fVar166;
      auVar32._28_4_ = uStack_4a4 ^ local_a20._28_4_;
      auVar124 = vfmadd231ps_fma(auVar32,auVar182,_local_680);
      auVar170 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar197,_local_660);
      auVar9 = vandps_avx(auVar50,ZEXT1632(auVar170));
      auVar132 = vrcpps_avx(ZEXT1632(auVar170));
      auVar232._8_4_ = 0x219392ef;
      auVar232._0_8_ = 0x219392ef219392ef;
      auVar232._12_4_ = 0x219392ef;
      auVar232._16_4_ = 0x219392ef;
      auVar232._20_4_ = 0x219392ef;
      auVar232._24_4_ = 0x219392ef;
      auVar232._28_4_ = 0x219392ef;
      auVar240 = vcmpps_avx(auVar9,auVar232,1);
      auVar155 = ZEXT1632(auVar170);
      auVar124 = vfnmadd213ps_fma(auVar132,auVar155,auVar216);
      auVar124 = vfmadd132ps_fma(ZEXT1632(auVar124),auVar132,auVar132);
      auVar198._0_4_ = local_4c0 ^ auVar170._0_4_;
      auVar198._4_4_ = uStack_4bc ^ auVar170._4_4_;
      auVar198._8_4_ = uStack_4b8 ^ auVar170._8_4_;
      auVar198._12_4_ = uStack_4b4 ^ auVar170._12_4_;
      auVar198._16_4_ = fStack_4b0;
      auVar198._20_4_ = fStack_4ac;
      auVar198._24_4_ = fStack_4a8;
      auVar198._28_4_ = uStack_4a4;
      auVar33._4_4_ = auVar124._4_4_ * (float)(uStack_4bc ^ auVar7._4_4_);
      auVar33._0_4_ = auVar124._0_4_ * (float)(local_4c0 ^ auVar7._0_4_);
      auVar33._8_4_ = auVar124._8_4_ * (float)(uStack_4b8 ^ auVar7._8_4_);
      auVar33._12_4_ = auVar124._12_4_ * (float)(uStack_4b4 ^ auVar7._12_4_);
      auVar33._16_4_ = fStack_4b0 * 0.0;
      auVar33._20_4_ = fStack_4ac * 0.0;
      auVar33._24_4_ = fStack_4a8 * 0.0;
      auVar33._28_4_ = uStack_4a4;
      auVar9 = vcmpps_avx(auVar155,auVar198,1);
      auVar9 = vorps_avx(auVar9,auVar240);
      auVar9 = vblendvps_avx(auVar33,auVar250,auVar9);
      local_3a0 = vmaxps_avx(auVar133,auVar9);
      auVar9 = vcmpps_avx(auVar155,auVar198,6);
      auVar9 = vorps_avx(auVar240,auVar9);
      auVar9 = vblendvps_avx(auVar33,auVar154,auVar9);
      auVar83 = vandps_avx(auVar83,local_340);
      local_3c0 = vminps_avx(auVar156,auVar9);
      auVar9 = vcmpps_avx(local_3a0,local_3c0,2);
      auVar240 = auVar83 & auVar9;
      if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar240 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar240 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar240 >> 0x7f,0) == '\0') &&
            (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar240 >> 0xbf,0) == '\0') &&
          (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar240[0x1f]) goto LAB_0162e168;
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = 0x3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar199._16_4_ = 0x3f800000;
      auVar199._20_4_ = 0x3f800000;
      auVar199._24_4_ = 0x3f800000;
      auVar199._28_4_ = 0x3f800000;
      auVar240 = vminps_avx(local_4e0,auVar199);
      auVar133 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar240 = vmaxps_avx(auVar240,auVar133);
      auVar154 = vminps_avx(_local_500,auVar199);
      auVar154 = vmaxps_avx(auVar154,auVar133);
      auVar34._4_4_ = (auVar240._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar240._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar240._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar240._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar240._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar240._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar240._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar240._28_4_ + 7.0;
      auVar124 = vfmadd213ps_fma(auVar34,local_600,local_5e0);
      auVar35._4_4_ = (auVar154._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar154._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar154._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar154._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar154._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar154._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar154._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar154._28_4_ + 7.0;
      auVar7 = vfmadd213ps_fma(auVar35,local_600,local_5e0);
      auVar240 = vminps_avx(local_620,local_640);
      auVar154 = vminps_avx(_local_860,_local_6c0);
      auVar240 = vminps_avx(auVar240,auVar154);
      auVar240 = vsubps_avx(auVar240,_local_540);
      auVar83 = vandps_avx(auVar9,auVar83);
      local_1a0 = ZEXT1632(auVar124);
      local_1c0 = ZEXT1632(auVar7);
      auVar36._4_4_ = auVar240._4_4_ * 0.99999976;
      auVar36._0_4_ = auVar240._0_4_ * 0.99999976;
      auVar36._8_4_ = auVar240._8_4_ * 0.99999976;
      auVar36._12_4_ = auVar240._12_4_ * 0.99999976;
      auVar36._16_4_ = auVar240._16_4_ * 0.99999976;
      auVar36._20_4_ = auVar240._20_4_ * 0.99999976;
      auVar36._24_4_ = auVar240._24_4_ * 0.99999976;
      auVar36._28_4_ = 0x3f7ffffc;
      auVar9 = vmaxps_avx(ZEXT832(0) << 0x20,auVar36);
      auVar37._4_4_ = auVar9._4_4_ * auVar9._4_4_;
      auVar37._0_4_ = auVar9._0_4_ * auVar9._0_4_;
      auVar37._8_4_ = auVar9._8_4_ * auVar9._8_4_;
      auVar37._12_4_ = auVar9._12_4_ * auVar9._12_4_;
      auVar37._16_4_ = auVar9._16_4_ * auVar9._16_4_;
      auVar37._20_4_ = auVar9._20_4_ * auVar9._20_4_;
      auVar37._24_4_ = auVar9._24_4_ * auVar9._24_4_;
      auVar37._28_4_ = auVar9._28_4_;
      auVar240 = vsubps_avx(local_700,auVar37);
      auVar38._4_4_ = auVar240._4_4_ * fVar120;
      auVar38._0_4_ = auVar240._0_4_ * fVar119;
      auVar38._8_4_ = auVar240._8_4_ * fStack_878;
      auVar38._12_4_ = auVar240._12_4_ * fStack_874;
      auVar38._16_4_ = auVar240._16_4_ * fStack_870;
      auVar38._20_4_ = auVar240._20_4_ * fStack_86c;
      auVar38._24_4_ = auVar240._24_4_ * fStack_868;
      auVar38._28_4_ = auVar9._28_4_;
      auVar9 = vsubps_avx(local_720,auVar38);
      local_aa0 = vcmpps_avx(auVar9,ZEXT1232(ZEXT812(0)) << 0x20,5);
      _local_860 = local_3a0;
      auVar154 = _local_860;
      if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0x7f,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_aa0 >> 0xbf,0) == '\0') &&
          (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_aa0[0x1f]) {
        auVar48 = ZEXT812(0);
        auVar132 = ZEXT1232(auVar48) << 0x20;
        local_700 = ZEXT1232(auVar48) << 0x20;
        local_720 = ZEXT1232(auVar48) << 0x20;
        _local_540 = ZEXT1232(auVar48) << 0x20;
        auVar156 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar221 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar200._8_4_ = 0x7f800000;
        auVar200._0_8_ = 0x7f8000007f800000;
        auVar200._12_4_ = 0x7f800000;
        auVar200._16_4_ = 0x7f800000;
        auVar200._20_4_ = 0x7f800000;
        auVar200._24_4_ = 0x7f800000;
        auVar200._28_4_ = 0x7f800000;
        auVar208._8_4_ = 0xff800000;
        auVar208._0_8_ = 0xff800000ff800000;
        auVar208._12_4_ = 0xff800000;
        auVar208._16_4_ = 0xff800000;
        auVar208._20_4_ = 0xff800000;
        auVar208._24_4_ = 0xff800000;
        auVar208._28_4_ = 0xff800000;
      }
      else {
        auVar132 = vsqrtps_avx(auVar9);
        auVar157._0_4_ = fVar184 + fVar184;
        auVar157._4_4_ = fVar202 + fVar202;
        auVar157._8_4_ = fVar203 + fVar203;
        auVar157._12_4_ = fVar204 + fVar204;
        auVar157._16_4_ = fVar205 + fVar205;
        auVar157._20_4_ = fVar206 + fVar206;
        auVar157._24_4_ = fVar207 + fVar207;
        auVar157._28_4_ = fVar95 + fVar95;
        auVar133 = vrcpps_avx(auVar157);
        auVar201._8_4_ = 0x3f800000;
        auVar201._0_8_ = 0x3f8000003f800000;
        auVar201._12_4_ = 0x3f800000;
        auVar201._16_4_ = 0x3f800000;
        auVar201._20_4_ = 0x3f800000;
        auVar201._24_4_ = 0x3f800000;
        auVar201._28_4_ = 0x3f800000;
        auVar124 = vfnmadd213ps_fma(auVar157,auVar133,auVar201);
        auVar124 = vfmadd132ps_fma(ZEXT1632(auVar124),auVar133,auVar133);
        auVar183._0_4_ = (uint)auVar228._0_4_ ^ local_4c0;
        auVar183._4_4_ = (uint)auVar228._4_4_ ^ uStack_4bc;
        auVar183._8_4_ = (uint)auVar228._8_4_ ^ uStack_4b8;
        auVar183._12_4_ = (uint)auVar228._12_4_ ^ uStack_4b4;
        auVar183._16_4_ = (uint)auVar228._16_4_ ^ (uint)fStack_4b0;
        auVar183._20_4_ = (uint)auVar228._20_4_ ^ (uint)fStack_4ac;
        auVar183._24_4_ = (uint)auVar228._24_4_ ^ (uint)fStack_4a8;
        auVar183._28_4_ = (uint)auVar228._28_4_ ^ uStack_4a4;
        auVar133 = vsubps_avx(auVar183,auVar132);
        auVar132 = vsubps_avx(auVar132,auVar228);
        fVar95 = auVar133._0_4_ * auVar124._0_4_;
        fVar119 = auVar133._4_4_ * auVar124._4_4_;
        auVar39._4_4_ = fVar119;
        auVar39._0_4_ = fVar95;
        fVar120 = auVar133._8_4_ * auVar124._8_4_;
        auVar39._8_4_ = fVar120;
        fVar184 = auVar133._12_4_ * auVar124._12_4_;
        auVar39._12_4_ = fVar184;
        fVar202 = auVar133._16_4_ * 0.0;
        auVar39._16_4_ = fVar202;
        fVar203 = auVar133._20_4_ * 0.0;
        auVar39._20_4_ = fVar203;
        fVar204 = auVar133._24_4_ * 0.0;
        auVar39._24_4_ = fVar204;
        auVar39._28_4_ = 0x3f800000;
        fVar205 = auVar132._0_4_ * auVar124._0_4_;
        fVar206 = auVar132._4_4_ * auVar124._4_4_;
        auVar40._4_4_ = fVar206;
        auVar40._0_4_ = fVar205;
        fVar207 = auVar132._8_4_ * auVar124._8_4_;
        auVar40._8_4_ = fVar207;
        fVar139 = auVar132._12_4_ * auVar124._12_4_;
        auVar40._12_4_ = fVar139;
        fVar161 = auVar132._16_4_ * 0.0;
        auVar40._16_4_ = fVar161;
        fVar162 = auVar132._20_4_ * 0.0;
        auVar40._20_4_ = fVar162;
        fVar163 = auVar132._24_4_ * 0.0;
        auVar40._24_4_ = fVar163;
        auVar40._28_4_ = fVar94;
        auVar124 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar39,_local_520);
        auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar40,_local_520);
        auVar41._28_4_ = auVar133._28_4_;
        auVar41._0_28_ =
             ZEXT1628(CONCAT412(fVar121 * auVar124._12_4_,
                                CONCAT48(fVar122 * auVar124._8_4_,
                                         CONCAT44(fVar118 * auVar124._4_4_,fVar117 * auVar124._0_4_)
                                        )));
        auVar133 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar121,
                                      CONCAT48(auVar79._8_4_ * fVar122,
                                               CONCAT44(auVar79._4_4_ * fVar118,
                                                        auVar79._0_4_ * fVar117))));
        auVar124 = vfmadd213ps_fma(local_480,auVar41,local_a40);
        auVar79 = vfmadd213ps_fma(local_480,auVar133,local_a40);
        auVar7 = vfmadd213ps_fma(local_4a0,auVar41,auVar84);
        auVar170 = vfmadd213ps_fma(local_4a0,auVar133,auVar84);
        auVar191 = vfmadd213ps_fma(auVar41,local_580,local_460);
        auVar8 = vfmadd213ps_fma(local_580,auVar133,local_460);
        auVar42._4_4_ = (float)local_660._4_4_ * fVar119;
        auVar42._0_4_ = (float)local_660._0_4_ * fVar95;
        auVar42._8_4_ = fStack_658 * fVar120;
        auVar42._12_4_ = fStack_654 * fVar184;
        auVar42._16_4_ = fStack_650 * fVar202;
        auVar42._20_4_ = fStack_64c * fVar203;
        auVar42._24_4_ = fStack_648 * fVar204;
        auVar42._28_4_ = 0;
        auVar132 = vsubps_avx(auVar42,ZEXT1632(auVar124));
        auVar158._0_4_ = (float)local_680._0_4_ * fVar95;
        auVar158._4_4_ = (float)local_680._4_4_ * fVar119;
        auVar158._8_4_ = fStack_678 * fVar120;
        auVar158._12_4_ = fStack_674 * fVar184;
        auVar158._16_4_ = fStack_670 * fVar202;
        auVar158._20_4_ = fStack_66c * fVar203;
        auVar158._24_4_ = fStack_668 * fVar204;
        auVar158._28_4_ = 0;
        auVar156 = vsubps_avx(auVar158,ZEXT1632(auVar7));
        auVar209._0_4_ = local_440 * fVar95;
        auVar209._4_4_ = fStack_43c * fVar119;
        auVar209._8_4_ = fStack_438 * fVar120;
        auVar209._12_4_ = fStack_434 * fVar184;
        auVar209._16_4_ = fStack_430 * fVar202;
        auVar209._20_4_ = fStack_42c * fVar203;
        auVar209._24_4_ = fStack_428 * fVar204;
        auVar209._28_4_ = 0;
        auVar155 = vsubps_avx(auVar209,ZEXT1632(auVar191));
        auVar43._4_4_ = fVar206 * (float)local_660._4_4_;
        auVar43._0_4_ = fVar205 * (float)local_660._0_4_;
        auVar43._8_4_ = fVar207 * fStack_658;
        auVar43._12_4_ = fVar139 * fStack_654;
        auVar43._16_4_ = fVar161 * fStack_650;
        auVar43._20_4_ = fVar162 * fStack_64c;
        auVar43._24_4_ = fVar163 * fStack_648;
        auVar43._28_4_ = 0;
        local_700 = vsubps_avx(auVar43,ZEXT1632(auVar79));
        auVar44._4_4_ = (float)local_680._4_4_ * fVar206;
        auVar44._0_4_ = (float)local_680._0_4_ * fVar205;
        auVar44._8_4_ = fStack_678 * fVar207;
        auVar44._12_4_ = fStack_674 * fVar139;
        auVar44._16_4_ = fStack_670 * fVar161;
        auVar44._20_4_ = fStack_66c * fVar162;
        auVar44._24_4_ = fStack_668 * fVar163;
        auVar44._28_4_ = local_700._28_4_;
        local_720 = vsubps_avx(auVar44,ZEXT1632(auVar170));
        auVar45._4_4_ = fStack_43c * fVar206;
        auVar45._0_4_ = local_440 * fVar205;
        auVar45._8_4_ = fStack_438 * fVar207;
        auVar45._12_4_ = fStack_434 * fVar139;
        auVar45._16_4_ = fStack_430 * fVar161;
        auVar45._20_4_ = fStack_42c * fVar162;
        auVar45._24_4_ = fStack_428 * fVar163;
        auVar45._28_4_ = local_720._28_4_;
        _local_540 = vsubps_avx(auVar45,ZEXT1632(auVar8));
        auVar133 = vcmpps_avx(auVar9,_DAT_01faff00,5);
        auVar210._8_4_ = 0x7f800000;
        auVar210._0_8_ = 0x7f8000007f800000;
        auVar210._12_4_ = 0x7f800000;
        auVar210._16_4_ = 0x7f800000;
        auVar210._20_4_ = 0x7f800000;
        auVar210._24_4_ = 0x7f800000;
        auVar210._28_4_ = 0x7f800000;
        auVar200 = vblendvps_avx(auVar210,auVar39,auVar133);
        auVar51._4_4_ = uStack_6dc;
        auVar51._0_4_ = local_6e0;
        auVar51._8_4_ = uStack_6d8;
        auVar51._12_4_ = uStack_6d4;
        auVar51._16_4_ = uStack_6d0;
        auVar51._20_4_ = uStack_6cc;
        auVar51._24_4_ = uStack_6c8;
        auVar51._28_4_ = uStack_6c4;
        auVar9 = vandps_avx(auVar51,local_800);
        auVar9 = vmaxps_avx(local_360,auVar9);
        auVar46._4_4_ = auVar9._4_4_ * 1.9073486e-06;
        auVar46._0_4_ = auVar9._0_4_ * 1.9073486e-06;
        auVar46._8_4_ = auVar9._8_4_ * 1.9073486e-06;
        auVar46._12_4_ = auVar9._12_4_ * 1.9073486e-06;
        auVar46._16_4_ = auVar9._16_4_ * 1.9073486e-06;
        auVar46._20_4_ = auVar9._20_4_ * 1.9073486e-06;
        auVar46._24_4_ = auVar9._24_4_ * 1.9073486e-06;
        auVar46._28_4_ = auVar9._28_4_;
        auVar9 = vandps_avx(auVar51,local_560);
        auVar9 = vcmpps_avx(auVar9,auVar46,1);
        auVar211._8_4_ = 0xff800000;
        auVar211._0_8_ = 0xff800000ff800000;
        auVar211._12_4_ = 0xff800000;
        auVar211._16_4_ = 0xff800000;
        auVar211._20_4_ = 0xff800000;
        auVar211._24_4_ = 0xff800000;
        auVar211._28_4_ = 0xff800000;
        auVar208 = vblendvps_avx(auVar211,auVar40,auVar133);
        auVar10 = auVar133 & auVar9;
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0x7f,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0xbf,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          auVar9 = vandps_avx(auVar9,auVar133);
          auVar10 = vcmpps_avx(auVar240,ZEXT832(0) << 0x20,2);
          auVar247._8_4_ = 0xff800000;
          auVar247._0_8_ = 0xff800000ff800000;
          auVar247._12_4_ = 0xff800000;
          auVar247._16_4_ = 0xff800000;
          auVar247._20_4_ = 0xff800000;
          auVar247._24_4_ = 0xff800000;
          auVar247._28_4_ = 0xff800000;
          auVar252._8_4_ = 0x7f800000;
          auVar252._0_8_ = 0x7f8000007f800000;
          auVar252._12_4_ = 0x7f800000;
          auVar252._16_4_ = 0x7f800000;
          auVar252._20_4_ = 0x7f800000;
          auVar252._24_4_ = 0x7f800000;
          auVar252._28_4_ = 0x7f800000;
          auVar240 = vblendvps_avx(auVar252,auVar247,auVar10);
          auVar124 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
          auVar11 = vpmovsxwd_avx2(auVar124);
          auVar200 = vblendvps_avx(auVar200,auVar240,auVar11);
          auVar240 = vblendvps_avx(auVar247,auVar252,auVar10);
          auVar208 = vblendvps_avx(auVar208,auVar240,auVar11);
          auVar223._0_8_ = auVar9._0_8_ ^ 0xffffffffffffffff;
          auVar223._8_4_ = auVar9._8_4_ ^ 0xffffffff;
          auVar223._12_4_ = auVar9._12_4_ ^ 0xffffffff;
          auVar223._16_4_ = auVar9._16_4_ ^ 0xffffffff;
          auVar223._20_4_ = auVar9._20_4_ ^ 0xffffffff;
          auVar223._24_4_ = auVar9._24_4_ ^ 0xffffffff;
          auVar223._28_4_ = auVar9._28_4_ ^ 0xffffffff;
          auVar9 = vorps_avx(auVar10,auVar223);
          local_aa0 = vandps_avx(auVar9,auVar133);
        }
        auVar221 = auVar155._0_28_;
      }
      auVar233 = ZEXT3264(local_3a0);
      auVar258 = ZEXT3264(local_980);
      auVar253 = ZEXT3264(local_9c0);
      auVar248 = ZEXT3264(local_9a0);
      auVar218 = ZEXT3264(local_9e0);
      uVar67 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar229._4_4_ = uVar67;
      auVar229._0_4_ = uVar67;
      auVar229._8_4_ = uVar67;
      auVar229._12_4_ = uVar67;
      auVar229._16_4_ = uVar67;
      auVar229._20_4_ = uVar67;
      auVar229._24_4_ = uVar67;
      auVar229._28_4_ = uVar67;
      auVar230 = ZEXT3264(auVar229);
      uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar242._4_4_ = uVar67;
      auVar242._0_4_ = uVar67;
      auVar242._8_4_ = uVar67;
      auVar242._12_4_ = uVar67;
      auVar242._16_4_ = uVar67;
      auVar242._20_4_ = uVar67;
      auVar242._24_4_ = uVar67;
      auVar242._28_4_ = uVar67;
      auVar243 = ZEXT3264(auVar242);
      fVar95 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_380 = vminps_avx(local_3c0,auVar200);
      local_3e0 = vmaxps_avx(local_3a0,auVar208);
      auVar9 = vcmpps_avx(local_3a0,local_380,2);
      local_560 = vandps_avx(auVar9,auVar83);
      auVar9 = vcmpps_avx(local_3e0,local_3c0,2);
      local_480 = vandps_avx(auVar9,auVar83);
      auVar83 = vorps_avx(local_480,local_560);
      if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar83 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar83 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar83 >> 0x7f,0) == '\0') &&
            (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar83 >> 0xbf,0) == '\0') &&
          (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar83[0x1f])
      {
        auVar224 = ZEXT3264(local_900);
      }
      else {
        local_580 = local_3e0;
        local_4a0._0_8_ = local_aa0._0_8_ ^ 0xffffffffffffffff;
        local_4a0._8_4_ = local_aa0._8_4_ ^ 0xffffffff;
        local_4a0._12_4_ = local_aa0._12_4_ ^ 0xffffffff;
        local_4a0._16_4_ = local_aa0._16_4_ ^ 0xffffffff;
        local_4a0._20_4_ = local_aa0._20_4_ ^ 0xffffffff;
        local_4a0._24_4_ = local_aa0._24_4_ ^ 0xffffffff;
        local_4a0._28_4_ = local_aa0._28_4_ ^ 0xffffffff;
        auVar47._4_4_ = auVar221._4_4_ * fVar95;
        auVar47._0_4_ = auVar221._0_4_ * fVar95;
        auVar47._8_4_ = auVar221._8_4_ * fVar95;
        auVar47._12_4_ = auVar221._12_4_ * fVar95;
        auVar47._16_4_ = auVar221._16_4_ * fVar95;
        auVar47._20_4_ = auVar221._20_4_ * fVar95;
        auVar47._24_4_ = auVar221._24_4_ * fVar95;
        auVar47._28_4_ = local_aa0._28_4_;
        auVar124 = vfmadd213ps_fma(auVar156,auVar242,auVar47);
        auVar124 = vfmadd213ps_fma(auVar132,auVar229,ZEXT1632(auVar124));
        auVar52._4_4_ = uStack_6dc;
        auVar52._0_4_ = local_6e0;
        auVar52._8_4_ = uStack_6d8;
        auVar52._12_4_ = uStack_6d4;
        auVar52._16_4_ = uStack_6d0;
        auVar52._20_4_ = uStack_6cc;
        auVar52._24_4_ = uStack_6c8;
        auVar52._28_4_ = uStack_6c4;
        auVar83 = vandps_avx(ZEXT1632(auVar124),auVar52);
        auVar113._8_4_ = 0x3e99999a;
        auVar113._0_8_ = 0x3e99999a3e99999a;
        auVar113._12_4_ = 0x3e99999a;
        auVar113._16_4_ = 0x3e99999a;
        auVar113._20_4_ = 0x3e99999a;
        auVar113._24_4_ = 0x3e99999a;
        auVar113._28_4_ = 0x3e99999a;
        auVar83 = vcmpps_avx(auVar83,auVar113,1);
        auVar83 = vorps_avx(auVar83,local_4a0);
        auVar114._8_4_ = 3;
        auVar114._0_8_ = 0x300000003;
        auVar114._12_4_ = 3;
        auVar114._16_4_ = 3;
        auVar114._20_4_ = 3;
        auVar114._24_4_ = 3;
        auVar114._28_4_ = 3;
        auVar134._8_4_ = 2;
        auVar134._0_8_ = 0x200000002;
        auVar134._12_4_ = 2;
        auVar134._16_4_ = 2;
        auVar134._20_4_ = 2;
        auVar134._24_4_ = 2;
        auVar134._28_4_ = 2;
        auVar83 = vblendvps_avx(auVar134,auVar114,auVar83);
        local_740._4_4_ = local_acc;
        local_740._0_4_ = local_acc;
        local_740._8_4_ = local_acc;
        local_740._12_4_ = local_acc;
        local_740._16_4_ = local_acc;
        local_740._20_4_ = local_acc;
        local_740._24_4_ = local_acc;
        local_740._28_4_ = local_acc;
        local_460 = vpcmpgtd_avx2(auVar83,local_740);
        local_420 = vpandn_avx2(local_460,local_560);
        auVar115 = ZEXT3264(local_420);
        auVar83 = local_560 & ~local_460;
        local_a20 = auVar13;
        local_a00 = auVar14;
        local_820 = auVar15;
        if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar83 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar83 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar83 >> 0x7f,0) == '\0') &&
              (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar83 >> 0xbf,0) == '\0') &&
            (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar83[0x1f]) {
          fVar117 = (ray->super_RayK<1>).tfar;
          auVar90._4_4_ = fVar117;
          auVar90._0_4_ = fVar117;
          auVar90._8_4_ = fVar117;
          auVar90._12_4_ = fVar117;
          auVar90._16_4_ = fVar117;
          auVar90._20_4_ = fVar117;
          auVar90._24_4_ = fVar117;
          auVar90._28_4_ = fVar117;
          auVar224 = ZEXT3264(local_900);
          fVar117 = fVar95;
          fVar118 = fVar95;
          fVar119 = fVar95;
          fVar122 = fVar95;
          fVar120 = fVar95;
          fVar121 = fVar95;
        }
        else {
          local_520._4_4_ = fVar95;
          local_520._0_4_ = fVar95;
          fStack_518 = fVar95;
          fStack_514 = fVar95;
          fStack_510 = fVar95;
          fStack_50c = fVar95;
          fStack_508 = fVar95;
          fStack_504 = fVar95;
          _local_500 = auVar242;
          local_4e0 = auVar229;
          auVar79 = vminps_avx(local_910,local_930);
          auVar124 = vmaxps_avx(local_910,local_930);
          auVar7 = vminps_avx(local_920,_local_940);
          auVar170 = vminps_avx(auVar79,auVar7);
          auVar79 = vmaxps_avx(local_920,_local_940);
          auVar7 = vmaxps_avx(auVar124,auVar79);
          auVar124 = vandps_avx(auVar170,local_950);
          auVar79 = vandps_avx(auVar7,local_950);
          auVar124 = vmaxps_avx(auVar124,auVar79);
          auVar79 = vmovshdup_avx(auVar124);
          auVar79 = vmaxss_avx(auVar79,auVar124);
          auVar124 = vshufpd_avx(auVar124,auVar124,1);
          auVar124 = vmaxss_avx(auVar124,auVar79);
          local_7c0._0_4_ = auVar124._0_4_ * 1.9073486e-06;
          local_640._0_16_ = vshufps_avx(auVar7,auVar7,0xff);
          local_860._0_4_ = local_3a0._0_4_;
          local_860._4_4_ = local_3a0._4_4_;
          fStack_858 = local_3a0._8_4_;
          fStack_854 = local_3a0._12_4_;
          fStack_850 = local_3a0._16_4_;
          fStack_84c = local_3a0._20_4_;
          fStack_848 = local_3a0._24_4_;
          fStack_844 = local_3a0._28_4_;
          local_6c0._4_4_ = (float)local_860._4_4_ + (float)local_7e0._4_4_;
          local_6c0._0_4_ = (float)local_860._0_4_ + (float)local_7e0._0_4_;
          fStack_6b8 = fStack_858 + fStack_7d8;
          fStack_6b4 = fStack_854 + fStack_7d4;
          fStack_6b0 = fStack_850 + fStack_7d0;
          fStack_6ac = fStack_84c + fStack_7cc;
          fStack_6a8 = fStack_848 + fStack_7c8;
          fStack_6a4 = fStack_844 + fStack_7c4;
          _local_860 = auVar154;
          do {
            auVar91._8_4_ = 0x7f800000;
            auVar91._0_8_ = 0x7f8000007f800000;
            auVar91._12_4_ = 0x7f800000;
            auVar91._16_4_ = 0x7f800000;
            auVar91._20_4_ = 0x7f800000;
            auVar91._24_4_ = 0x7f800000;
            auVar91._28_4_ = 0x7f800000;
            auVar83 = auVar115._0_32_;
            auVar9 = vblendvps_avx(auVar91,_local_860,auVar83);
            auVar240 = vshufps_avx(auVar9,auVar9,0xb1);
            auVar240 = vminps_avx(auVar9,auVar240);
            auVar154 = vshufpd_avx(auVar240,auVar240,5);
            auVar240 = vminps_avx(auVar240,auVar154);
            auVar154 = vpermpd_avx2(auVar240,0x4e);
            auVar240 = vminps_avx(auVar240,auVar154);
            auVar9 = vcmpps_avx(auVar9,auVar240,0);
            auVar240 = auVar83 & auVar9;
            if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar240 >> 0x7f,0) != '\0') ||
                  (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar240 >> 0xbf,0) != '\0') ||
                (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar240[0x1f] < '\0') {
              auVar83 = vandps_avx(auVar9,auVar83);
            }
            uVar61 = vmovmskps_avx(auVar83);
            iVar12 = 0;
            for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar12 = iVar12 + 1;
            }
            uVar62 = iVar12 << 2;
            *(undefined4 *)(local_420 + uVar62) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_780._0_16_ = (undefined1  [16])aVar1;
            auVar124 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar61 = *(uint *)(local_1a0 + uVar62);
            if (auVar124._0_4_ < 0.0) {
              local_a40._0_16_ = ZEXT416(*(uint *)(local_3a0 + uVar62));
              fVar95 = sqrtf(auVar124._0_4_);
              auVar124 = local_a40._0_16_;
            }
            else {
              auVar124 = vsqrtss_avx(auVar124,auVar124);
              fVar95 = auVar124._0_4_;
              auVar124 = ZEXT416(*(uint *)(local_3a0 + uVar62));
            }
            local_800._0_4_ = fVar95 * 1.9073486e-06;
            auVar124 = vinsertps_avx(auVar124,ZEXT416(uVar61),0x10);
            lVar64 = 5;
            do {
              auVar7 = vmovshdup_avx(auVar124);
              fVar122 = 1.0 - auVar7._0_4_;
              local_8e0._0_16_ = ZEXT416((uint)fVar122);
              auVar79 = vshufps_avx(auVar124,auVar124,0x55);
              fVar95 = auVar79._0_4_;
              auVar99._0_4_ = local_930._0_4_ * fVar95;
              fVar117 = auVar79._4_4_;
              auVar99._4_4_ = local_930._4_4_ * fVar117;
              fVar118 = auVar79._8_4_;
              auVar99._8_4_ = local_930._8_4_ * fVar118;
              fVar119 = auVar79._12_4_;
              auVar99._12_4_ = local_930._12_4_ * fVar119;
              auVar125._4_4_ = fVar122;
              auVar125._0_4_ = fVar122;
              auVar125._8_4_ = fVar122;
              auVar125._12_4_ = fVar122;
              auVar79 = vfmadd231ps_fma(auVar99,auVar125,local_910);
              auVar141._0_4_ = local_920._0_4_ * fVar95;
              auVar141._4_4_ = local_920._4_4_ * fVar117;
              auVar141._8_4_ = local_920._8_4_ * fVar118;
              auVar141._12_4_ = local_920._12_4_ * fVar119;
              auVar170 = vfmadd231ps_fma(auVar141,auVar125,local_930);
              auVar190._0_4_ = fVar95 * auVar170._0_4_;
              auVar190._4_4_ = fVar117 * auVar170._4_4_;
              auVar190._8_4_ = fVar118 * auVar170._8_4_;
              auVar190._12_4_ = fVar119 * auVar170._12_4_;
              auVar191 = vfmadd231ps_fma(auVar190,auVar125,auVar79);
              auVar100._0_4_ = fVar95 * (float)local_940._0_4_;
              auVar100._4_4_ = fVar117 * (float)local_940._4_4_;
              auVar100._8_4_ = fVar118 * fStack_938;
              auVar100._12_4_ = fVar119 * fStack_934;
              auVar79 = vfmadd231ps_fma(auVar100,auVar125,local_920);
              auVar169._0_4_ = fVar95 * auVar79._0_4_;
              auVar169._4_4_ = fVar117 * auVar79._4_4_;
              auVar169._8_4_ = fVar118 * auVar79._8_4_;
              auVar169._12_4_ = fVar119 * auVar79._12_4_;
              auVar170 = vfmadd231ps_fma(auVar169,auVar125,auVar170);
              fVar120 = auVar124._0_4_;
              auVar101._4_4_ = fVar120;
              auVar101._0_4_ = fVar120;
              auVar101._8_4_ = fVar120;
              auVar101._12_4_ = fVar120;
              auVar79 = vfmadd213ps_fma(auVar101,local_780._0_16_,_DAT_01f7aa10);
              auVar75._0_4_ = fVar95 * auVar170._0_4_;
              auVar75._4_4_ = fVar117 * auVar170._4_4_;
              auVar75._8_4_ = fVar118 * auVar170._8_4_;
              auVar75._12_4_ = fVar119 * auVar170._12_4_;
              auVar8 = vfmadd231ps_fma(auVar75,auVar191,auVar125);
              local_5c0._0_16_ = auVar8;
              auVar79 = vsubps_avx(auVar79,auVar8);
              _local_7a0 = auVar79;
              auVar79 = vdpps_avx(auVar79,auVar79,0x7f);
              local_a40._0_16_ = auVar79;
              if (auVar79._0_4_ < 0.0) {
                local_8e0._0_16_ = ZEXT416((uint)fVar122);
                local_a00._0_16_ = auVar191;
                local_a20._0_16_ = auVar170;
                auVar218._0_4_ = sqrtf(auVar79._0_4_);
                auVar218._4_60_ = extraout_var;
                auVar79 = auVar218._0_16_;
                auVar170 = local_a20._0_16_;
                auVar191 = local_a00._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
              }
              auVar170 = vsubps_avx(auVar170,auVar191);
              auVar213._0_4_ = auVar170._0_4_ * 3.0;
              auVar213._4_4_ = auVar170._4_4_ * 3.0;
              auVar213._8_4_ = auVar170._8_4_ * 3.0;
              auVar213._12_4_ = auVar170._12_4_ * 3.0;
              auVar170 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8e0._0_16_,auVar7);
              auVar191 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar7,local_8e0._0_16_);
              fVar95 = local_8e0._0_4_ * 6.0;
              fVar117 = auVar170._0_4_ * 6.0;
              fVar118 = auVar191._0_4_ * 6.0;
              fVar119 = auVar7._0_4_ * 6.0;
              auVar142._0_4_ = fVar119 * (float)local_940._0_4_;
              auVar142._4_4_ = fVar119 * (float)local_940._4_4_;
              auVar142._8_4_ = fVar119 * fStack_938;
              auVar142._12_4_ = fVar119 * fStack_934;
              auVar102._4_4_ = fVar118;
              auVar102._0_4_ = fVar118;
              auVar102._8_4_ = fVar118;
              auVar102._12_4_ = fVar118;
              auVar7 = vfmadd132ps_fma(auVar102,auVar142,local_920);
              auVar143._4_4_ = fVar117;
              auVar143._0_4_ = fVar117;
              auVar143._8_4_ = fVar117;
              auVar143._12_4_ = fVar117;
              auVar7 = vfmadd132ps_fma(auVar143,auVar7,local_930);
              auVar170 = vdpps_avx(auVar213,auVar213,0x7f);
              auVar103._4_4_ = fVar95;
              auVar103._0_4_ = fVar95;
              auVar103._8_4_ = fVar95;
              auVar103._12_4_ = fVar95;
              auVar8 = vfmadd132ps_fma(auVar103,auVar7,local_910);
              auVar7 = vblendps_avx(auVar170,_DAT_01f7aa10,0xe);
              auVar191 = vrsqrtss_avx(auVar7,auVar7);
              fVar118 = auVar170._0_4_;
              fVar95 = auVar191._0_4_;
              auVar191 = vdpps_avx(auVar213,auVar8,0x7f);
              fVar95 = fVar95 * 1.5 + fVar118 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar104._0_4_ = auVar8._0_4_ * fVar118;
              auVar104._4_4_ = auVar8._4_4_ * fVar118;
              auVar104._8_4_ = auVar8._8_4_ * fVar118;
              auVar104._12_4_ = auVar8._12_4_ * fVar118;
              fVar117 = auVar191._0_4_;
              auVar192._0_4_ = auVar213._0_4_ * fVar117;
              auVar192._4_4_ = auVar213._4_4_ * fVar117;
              auVar192._8_4_ = auVar213._8_4_ * fVar117;
              auVar192._12_4_ = auVar213._12_4_ * fVar117;
              auVar191 = vsubps_avx(auVar104,auVar192);
              auVar7 = vrcpss_avx(auVar7,auVar7);
              auVar8 = vfnmadd213ss_fma(auVar7,auVar170,ZEXT416(0x40000000));
              fVar117 = auVar7._0_4_ * auVar8._0_4_;
              auVar7 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                  ZEXT416((uint)(fVar120 * (float)local_800._0_4_)));
              uVar59 = CONCAT44(auVar213._4_4_,auVar213._0_4_);
              auVar226._0_8_ = uVar59 ^ 0x8000000080000000;
              auVar226._8_4_ = -auVar213._8_4_;
              auVar226._12_4_ = -auVar213._12_4_;
              local_840._0_4_ = fVar95 * auVar191._0_4_ * fVar117;
              local_840._4_4_ = fVar95 * auVar191._4_4_ * fVar117;
              local_840._8_4_ = fVar95 * auVar191._8_4_ * fVar117;
              local_840._12_4_ = fVar95 * auVar191._12_4_ * fVar117;
              local_820._0_4_ = auVar213._0_4_ * fVar95;
              local_820._4_4_ = auVar213._4_4_ * fVar95;
              local_820._8_4_ = auVar213._8_4_ * fVar95;
              local_820._12_4_ = auVar213._12_4_ * fVar95;
              local_8e0._0_16_ = auVar213;
              if (fVar118 < -fVar118) {
                local_a00._0_4_ = auVar79._0_4_;
                local_a20._0_16_ = auVar226;
                fVar95 = sqrtf(fVar118);
                auVar79 = ZEXT416((uint)local_a00._0_4_);
                auVar226 = local_a20._0_16_;
                auVar170 = local_820._0_16_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar170,auVar170);
                fVar95 = auVar170._0_4_;
                auVar170 = local_820._0_16_;
              }
              auVar233 = ZEXT1664(auVar170);
              local_a00._0_16_ = vdpps_avx(_local_7a0,auVar170,0x7f);
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar79,
                                        ZEXT416((uint)auVar7._0_4_));
              auVar191 = vdpps_avx(auVar226,auVar170,0x7f);
              auVar8 = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar72 = vdpps_avx(local_780._0_16_,auVar170,0x7f);
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(auVar79._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar95)),auVar71);
              local_a20._0_4_ = auVar79._0_4_;
              auVar76._0_4_ = local_a00._0_4_ * local_a00._0_4_;
              auVar76._4_4_ = local_a00._4_4_ * local_a00._4_4_;
              auVar76._8_4_ = local_a00._8_4_ * local_a00._8_4_;
              auVar76._12_4_ = local_a00._12_4_ * local_a00._12_4_;
              auVar79 = vdpps_avx(_local_7a0,auVar226,0x7f);
              auVar123 = vsubps_avx(local_a40._0_16_,auVar76);
              auVar71 = vrsqrtss_avx(auVar123,auVar123);
              fVar117 = auVar123._0_4_;
              fVar95 = auVar71._0_4_;
              fVar95 = fVar95 * 1.5 + fVar117 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar71 = vdpps_avx(_local_7a0,local_780._0_16_,0x7f);
              local_820._0_16_ = ZEXT416((uint)(auVar191._0_4_ + auVar8._0_4_));
              local_840._0_16_ = vfnmadd231ss_fma(auVar79,local_a00._0_16_,local_820._0_16_);
              auVar79 = vfnmadd231ss_fma(auVar71,local_a00._0_16_,auVar72);
              if (fVar117 < 0.0) {
                local_5e0._0_16_ = auVar72;
                local_600._0_4_ = fVar95;
                local_620._0_16_ = auVar79;
                auVar233 = ZEXT1664(auVar170);
                fVar117 = sqrtf(fVar117);
                fVar95 = (float)local_600._0_4_;
                auVar79 = local_620._0_16_;
                auVar72 = local_5e0._0_16_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar123,auVar123);
                fVar117 = auVar170._0_4_;
              }
              auVar248 = ZEXT3264(local_9a0);
              auVar253 = ZEXT3264(local_9c0);
              auVar218 = ZEXT3264(local_9e0);
              auVar224 = ZEXT3264(local_900);
              auVar170 = vpermilps_avx(local_5c0._0_16_,0xff);
              fVar117 = fVar117 - auVar170._0_4_;
              auVar191 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xff);
              auVar170 = vfmsub213ss_fma(local_840._0_16_,ZEXT416((uint)fVar95),auVar191);
              auVar144._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar144._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar144._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar171._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
              auVar171._8_4_ = auVar170._8_4_ ^ 0x80000000;
              auVar171._12_4_ = auVar170._12_4_ ^ 0x80000000;
              auVar79 = ZEXT416((uint)(auVar79._0_4_ * fVar95));
              auVar170 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar170._0_4_)),
                                         local_820._0_16_,auVar79);
              auVar79 = vinsertps_avx(auVar171,auVar79,0x1c);
              uVar67 = auVar170._0_4_;
              auVar172._4_4_ = uVar67;
              auVar172._0_4_ = uVar67;
              auVar172._8_4_ = uVar67;
              auVar172._12_4_ = uVar67;
              auVar79 = vdivps_avx(auVar79,auVar172);
              auVar170 = vinsertps_avx(local_820._0_16_,auVar144,0x10);
              auVar170 = vdivps_avx(auVar170,auVar172);
              fVar95 = local_a00._0_4_;
              auVar126._0_4_ = fVar95 * auVar79._0_4_ + fVar117 * auVar170._0_4_;
              auVar126._4_4_ = fVar95 * auVar79._4_4_ + fVar117 * auVar170._4_4_;
              auVar126._8_4_ = fVar95 * auVar79._8_4_ + fVar117 * auVar170._8_4_;
              auVar126._12_4_ = fVar95 * auVar79._12_4_ + fVar117 * auVar170._12_4_;
              auVar124 = vsubps_avx(auVar124,auVar126);
              auVar79 = vandps_avx(local_a00._0_16_,local_950);
              if (auVar79._0_4_ < (float)local_a20._0_4_) {
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a20._0_4_ + auVar7._0_4_)),
                                         local_640._0_16_,ZEXT416(0x36000000));
                auVar79 = vandps_avx(ZEXT416((uint)fVar117),local_950);
                if (auVar79._0_4_ < auVar7._0_4_) {
                  fVar95 = auVar124._0_4_ + (float)local_750._0_4_;
                  auVar258 = ZEXT3264(local_980);
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar95) &&
                     (fVar117 = (ray->super_RayK<1>).tfar, fVar95 <= fVar117)) {
                    auVar124 = vmovshdup_avx(auVar124);
                    fVar118 = auVar124._0_4_;
                    if ((0.0 <= fVar118) && (fVar118 <= 1.0)) {
                      auVar124 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                      fVar119 = auVar124._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar58].ptr;
                      if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar119 = fVar119 * 1.5 +
                                  local_a40._0_4_ * -0.5 * fVar119 * fVar119 * fVar119;
                        auVar145._0_4_ = fVar119 * (float)local_7a0._0_4_;
                        auVar145._4_4_ = fVar119 * (float)local_7a0._4_4_;
                        auVar145._8_4_ = fVar119 * fStack_798;
                        auVar145._12_4_ = fVar119 * fStack_794;
                        auVar170 = vfmadd213ps_fma(auVar191,auVar145,local_8e0._0_16_);
                        auVar124 = vshufps_avx(auVar145,auVar145,0xc9);
                        auVar79 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xc9);
                        auVar146._0_4_ = auVar145._0_4_ * auVar79._0_4_;
                        auVar146._4_4_ = auVar145._4_4_ * auVar79._4_4_;
                        auVar146._8_4_ = auVar145._8_4_ * auVar79._8_4_;
                        auVar146._12_4_ = auVar145._12_4_ * auVar79._12_4_;
                        auVar7 = vfmsub231ps_fma(auVar146,local_8e0._0_16_,auVar124);
                        auVar124 = vshufps_avx(auVar7,auVar7,0xc9);
                        auVar79 = vshufps_avx(auVar170,auVar170,0xc9);
                        auVar7 = vshufps_avx(auVar7,auVar7,0xd2);
                        auVar77._0_4_ = auVar170._0_4_ * auVar7._0_4_;
                        auVar77._4_4_ = auVar170._4_4_ * auVar7._4_4_;
                        auVar77._8_4_ = auVar170._8_4_ * auVar7._8_4_;
                        auVar77._12_4_ = auVar170._12_4_ * auVar7._12_4_;
                        auVar124 = vfmsub231ps_fma(auVar77,auVar124,auVar79);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar95;
                          auVar79 = vshufps_avx(auVar124,auVar124,0xe9);
                          uVar68 = vmovlps_avx(auVar79);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar68;
                          (ray->Ng).field_0.field_0.z = auVar124._0_4_;
                          ray->u = fVar118;
                          ray->v = 0.0;
                          ray->primID = (uint)local_880;
                          ray->geomID = uVar58;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar79 = vshufps_avx(auVar124,auVar124,0xe9);
                          local_8b0 = vmovlps_avx(auVar79);
                          local_8a8 = auVar124._0_4_;
                          local_8a4 = fVar118;
                          local_8a0 = 0;
                          local_89c = (uint)local_880;
                          local_898 = uVar58;
                          local_894 = context->user->instID[0];
                          local_890 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar95;
                          local_5a0._0_4_ = 0xffffffff;
                          local_a78.valid = (int *)local_5a0;
                          local_a78.geometryUserPtr = pGVar4->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8b0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0162f000:
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar233 = ZEXT1664(auVar233._0_16_);
                              (*p_Var5)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_0162f08e;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            (*pGVar4->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_0162f000;
LAB_0162f08e:
                            (ray->super_RayK<1>).tfar = fVar117;
                          }
                          auVar258 = ZEXT3264(local_980);
                          auVar248 = ZEXT3264(local_9a0);
                          auVar253 = ZEXT3264(local_9c0);
                          auVar218 = ZEXT3264(local_9e0);
                          auVar224 = ZEXT3264(local_900);
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar64 = lVar64 + -1;
              auVar258 = ZEXT3264(local_980);
            } while (lVar64 != 0);
            auVar9 = local_420;
            fVar95 = (ray->super_RayK<1>).tfar;
            auVar90._4_4_ = fVar95;
            auVar90._0_4_ = fVar95;
            auVar90._8_4_ = fVar95;
            auVar90._12_4_ = fVar95;
            auVar90._16_4_ = fVar95;
            auVar90._20_4_ = fVar95;
            auVar90._24_4_ = fVar95;
            auVar90._28_4_ = fVar95;
            auVar83 = vcmpps_avx(_local_6c0,auVar90,2);
            local_420 = vandps_avx(auVar83,local_420);
            auVar115 = ZEXT3264(local_420);
            auVar9 = auVar9 & auVar83;
          } while ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar9 >> 0x7f,0) != '\0') ||
                     (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar9 >> 0xbf,0) != '\0') ||
                   (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar9[0x1f] < '\0');
          auVar230 = ZEXT3264(local_4e0);
          auVar243 = ZEXT3264(_local_500);
          fVar95 = (float)local_520._0_4_;
          fVar117 = (float)local_520._4_4_;
          fVar118 = fStack_518;
          fVar119 = fStack_514;
          fVar122 = fStack_510;
          fVar120 = fStack_50c;
          fVar121 = fStack_508;
        }
        auVar116._0_4_ = fVar95 * (float)local_540._0_4_;
        auVar116._4_4_ = fVar117 * (float)local_540._4_4_;
        auVar116._8_4_ = fVar118 * fStack_538;
        auVar116._12_4_ = fVar119 * fStack_534;
        auVar116._16_4_ = fVar122 * fStack_530;
        auVar116._20_4_ = fVar120 * fStack_52c;
        auVar116._28_36_ = auVar115._28_36_;
        auVar116._24_4_ = fVar121 * fStack_528;
        auVar124 = vfmadd213ps_fma(local_720,auVar243._0_32_,auVar116._0_32_);
        auVar124 = vfmadd213ps_fma(local_700,auVar230._0_32_,ZEXT1632(auVar124));
        auVar53._4_4_ = uStack_6dc;
        auVar53._0_4_ = local_6e0;
        auVar53._8_4_ = uStack_6d8;
        auVar53._12_4_ = uStack_6d4;
        auVar53._16_4_ = uStack_6d0;
        auVar53._20_4_ = uStack_6cc;
        auVar53._24_4_ = uStack_6c8;
        auVar53._28_4_ = uStack_6c4;
        auVar83 = vandps_avx(ZEXT1632(auVar124),auVar53);
        auVar135._8_4_ = 0x3e99999a;
        auVar135._0_8_ = 0x3e99999a3e99999a;
        auVar135._12_4_ = 0x3e99999a;
        auVar135._16_4_ = 0x3e99999a;
        auVar135._20_4_ = 0x3e99999a;
        auVar135._24_4_ = 0x3e99999a;
        auVar135._28_4_ = 0x3e99999a;
        auVar83 = vcmpps_avx(auVar83,auVar135,1);
        auVar9 = vorps_avx(auVar83,local_4a0);
        auVar136._0_4_ = (float)local_7e0._0_4_ + local_580._0_4_;
        auVar136._4_4_ = (float)local_7e0._4_4_ + local_580._4_4_;
        auVar136._8_4_ = fStack_7d8 + local_580._8_4_;
        auVar136._12_4_ = fStack_7d4 + local_580._12_4_;
        auVar136._16_4_ = fStack_7d0 + local_580._16_4_;
        auVar136._20_4_ = fStack_7cc + local_580._20_4_;
        auVar136._24_4_ = fStack_7c8 + local_580._24_4_;
        auVar136._28_4_ = fStack_7c4 + local_580._28_4_;
        auVar83 = vcmpps_avx(auVar136,auVar90,2);
        local_720 = vandps_avx(auVar83,local_480);
        auVar137._8_4_ = 3;
        auVar137._0_8_ = 0x300000003;
        auVar137._12_4_ = 3;
        auVar137._16_4_ = 3;
        auVar137._20_4_ = 3;
        auVar137._24_4_ = 3;
        auVar137._28_4_ = 3;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar83 = vblendvps_avx(auVar159,auVar137,auVar9);
        local_700 = vpcmpgtd_avx2(auVar83,local_740);
        local_5a0 = vpandn_avx2(local_700,local_720);
        auVar83 = local_720 & ~local_700;
        if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar83 >> 0x7f,0) != '\0') ||
              (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar83 >> 0xbf,0) != '\0') ||
            (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar83[0x1f] < '\0') {
          auVar79 = vminps_avx(local_910,local_930);
          auVar124 = vmaxps_avx(local_910,local_930);
          _local_860 = local_3e0;
          auVar7 = vminps_avx(local_920,_local_940);
          auVar170 = vminps_avx(auVar79,auVar7);
          auVar79 = vmaxps_avx(local_920,_local_940);
          auVar7 = vmaxps_avx(auVar124,auVar79);
          auVar124 = vandps_avx(auVar170,local_950);
          auVar79 = vandps_avx(auVar7,local_950);
          auVar124 = vmaxps_avx(auVar124,auVar79);
          auVar79 = vmovshdup_avx(auVar124);
          auVar79 = vmaxss_avx(auVar79,auVar124);
          auVar124 = vshufpd_avx(auVar124,auVar124,1);
          auVar124 = vmaxss_avx(auVar124,auVar79);
          local_7c0._0_4_ = auVar124._0_4_ * 1.9073486e-06;
          local_640._0_16_ = vshufps_avx(auVar7,auVar7,0xff);
          local_6c0._4_4_ = (float)local_7e0._4_4_ + local_3e0._4_4_;
          local_6c0._0_4_ = (float)local_7e0._0_4_ + local_3e0._0_4_;
          fStack_6b8 = fStack_7d8 + local_3e0._8_4_;
          fStack_6b4 = fStack_7d4 + local_3e0._12_4_;
          fStack_6b0 = fStack_7d0 + local_3e0._16_4_;
          fStack_6ac = fStack_7cc + local_3e0._20_4_;
          fStack_6a8 = fStack_7c8 + local_3e0._24_4_;
          fStack_6a4 = fStack_7c4 + local_3e0._28_4_;
          do {
            auVar92._8_4_ = 0x7f800000;
            auVar92._0_8_ = 0x7f8000007f800000;
            auVar92._12_4_ = 0x7f800000;
            auVar92._16_4_ = 0x7f800000;
            auVar92._20_4_ = 0x7f800000;
            auVar92._24_4_ = 0x7f800000;
            auVar92._28_4_ = 0x7f800000;
            auVar83 = vblendvps_avx(auVar92,_local_860,local_5a0);
            auVar9 = vshufps_avx(auVar83,auVar83,0xb1);
            auVar9 = vminps_avx(auVar83,auVar9);
            auVar240 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vminps_avx(auVar9,auVar240);
            auVar240 = vpermpd_avx2(auVar9,0x4e);
            auVar9 = vminps_avx(auVar9,auVar240);
            auVar9 = vcmpps_avx(auVar83,auVar9,0);
            auVar240 = local_5a0 & auVar9;
            auVar83 = local_5a0;
            if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar240 >> 0x7f,0) != '\0') ||
                  (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar240 >> 0xbf,0) != '\0') ||
                (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar240[0x1f] < '\0') {
              auVar83 = vandps_avx(auVar9,local_5a0);
            }
            uVar61 = vmovmskps_avx(auVar83);
            iVar12 = 0;
            for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar12 = iVar12 + 1;
            }
            uVar62 = iVar12 << 2;
            *(undefined4 *)(local_5a0 + uVar62) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_780._0_16_ = (undefined1  [16])aVar1;
            auVar124 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar61 = *(uint *)(local_1c0 + uVar62);
            if (auVar124._0_4_ < 0.0) {
              local_a40._0_16_ = ZEXT416(*(uint *)(local_3c0 + uVar62));
              fVar95 = sqrtf(auVar124._0_4_);
              auVar124 = local_a40._0_16_;
            }
            else {
              auVar124 = vsqrtss_avx(auVar124,auVar124);
              fVar95 = auVar124._0_4_;
              auVar124 = ZEXT416(*(uint *)(local_3c0 + uVar62));
            }
            local_800._0_4_ = fVar95 * 1.9073486e-06;
            auVar124 = vinsertps_avx(auVar124,ZEXT416(uVar61),0x10);
            lVar64 = 5;
            do {
              auVar7 = vmovshdup_avx(auVar124);
              fVar122 = 1.0 - auVar7._0_4_;
              local_8e0._0_16_ = ZEXT416((uint)fVar122);
              auVar79 = vshufps_avx(auVar124,auVar124,0x55);
              fVar95 = auVar79._0_4_;
              auVar105._0_4_ = local_930._0_4_ * fVar95;
              fVar117 = auVar79._4_4_;
              auVar105._4_4_ = local_930._4_4_ * fVar117;
              fVar118 = auVar79._8_4_;
              auVar105._8_4_ = local_930._8_4_ * fVar118;
              fVar119 = auVar79._12_4_;
              auVar105._12_4_ = local_930._12_4_ * fVar119;
              auVar127._4_4_ = fVar122;
              auVar127._0_4_ = fVar122;
              auVar127._8_4_ = fVar122;
              auVar127._12_4_ = fVar122;
              auVar79 = vfmadd231ps_fma(auVar105,auVar127,local_910);
              auVar147._0_4_ = local_920._0_4_ * fVar95;
              auVar147._4_4_ = local_920._4_4_ * fVar117;
              auVar147._8_4_ = local_920._8_4_ * fVar118;
              auVar147._12_4_ = local_920._12_4_ * fVar119;
              auVar170 = vfmadd231ps_fma(auVar147,auVar127,local_930);
              auVar193._0_4_ = fVar95 * auVar170._0_4_;
              auVar193._4_4_ = fVar117 * auVar170._4_4_;
              auVar193._8_4_ = fVar118 * auVar170._8_4_;
              auVar193._12_4_ = fVar119 * auVar170._12_4_;
              auVar191 = vfmadd231ps_fma(auVar193,auVar127,auVar79);
              auVar106._0_4_ = fVar95 * (float)local_940._0_4_;
              auVar106._4_4_ = fVar117 * (float)local_940._4_4_;
              auVar106._8_4_ = fVar118 * fStack_938;
              auVar106._12_4_ = fVar119 * fStack_934;
              auVar79 = vfmadd231ps_fma(auVar106,auVar127,local_920);
              auVar173._0_4_ = fVar95 * auVar79._0_4_;
              auVar173._4_4_ = fVar117 * auVar79._4_4_;
              auVar173._8_4_ = fVar118 * auVar79._8_4_;
              auVar173._12_4_ = fVar119 * auVar79._12_4_;
              auVar170 = vfmadd231ps_fma(auVar173,auVar127,auVar170);
              fVar120 = auVar124._0_4_;
              auVar107._4_4_ = fVar120;
              auVar107._0_4_ = fVar120;
              auVar107._8_4_ = fVar120;
              auVar107._12_4_ = fVar120;
              auVar79 = vfmadd213ps_fma(auVar107,local_780._0_16_,_DAT_01f7aa10);
              auVar78._0_4_ = fVar95 * auVar170._0_4_;
              auVar78._4_4_ = fVar117 * auVar170._4_4_;
              auVar78._8_4_ = fVar118 * auVar170._8_4_;
              auVar78._12_4_ = fVar119 * auVar170._12_4_;
              auVar8 = vfmadd231ps_fma(auVar78,auVar191,auVar127);
              local_5c0._0_16_ = auVar8;
              auVar79 = vsubps_avx(auVar79,auVar8);
              _local_7a0 = auVar79;
              auVar79 = vdpps_avx(auVar79,auVar79,0x7f);
              local_a40._0_16_ = auVar79;
              if (auVar79._0_4_ < 0.0) {
                local_8e0._0_16_ = ZEXT416((uint)fVar122);
                local_a00._0_16_ = auVar191;
                local_a20._0_16_ = auVar170;
                auVar248._0_4_ = sqrtf(auVar79._0_4_);
                auVar248._4_60_ = extraout_var_00;
                auVar79 = auVar248._0_16_;
                auVar170 = local_a20._0_16_;
                auVar191 = local_a00._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
              }
              auVar170 = vsubps_avx(auVar170,auVar191);
              auVar214._0_4_ = auVar170._0_4_ * 3.0;
              auVar214._4_4_ = auVar170._4_4_ * 3.0;
              auVar214._8_4_ = auVar170._8_4_ * 3.0;
              auVar214._12_4_ = auVar170._12_4_ * 3.0;
              auVar170 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8e0._0_16_,auVar7);
              auVar191 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar7,local_8e0._0_16_);
              fVar95 = local_8e0._0_4_ * 6.0;
              fVar117 = auVar170._0_4_ * 6.0;
              fVar118 = auVar191._0_4_ * 6.0;
              fVar119 = auVar7._0_4_ * 6.0;
              auVar148._0_4_ = fVar119 * (float)local_940._0_4_;
              auVar148._4_4_ = fVar119 * (float)local_940._4_4_;
              auVar148._8_4_ = fVar119 * fStack_938;
              auVar148._12_4_ = fVar119 * fStack_934;
              auVar108._4_4_ = fVar118;
              auVar108._0_4_ = fVar118;
              auVar108._8_4_ = fVar118;
              auVar108._12_4_ = fVar118;
              auVar7 = vfmadd132ps_fma(auVar108,auVar148,local_920);
              auVar149._4_4_ = fVar117;
              auVar149._0_4_ = fVar117;
              auVar149._8_4_ = fVar117;
              auVar149._12_4_ = fVar117;
              auVar7 = vfmadd132ps_fma(auVar149,auVar7,local_930);
              auVar170 = vdpps_avx(auVar214,auVar214,0x7f);
              auVar109._4_4_ = fVar95;
              auVar109._0_4_ = fVar95;
              auVar109._8_4_ = fVar95;
              auVar109._12_4_ = fVar95;
              auVar8 = vfmadd132ps_fma(auVar109,auVar7,local_910);
              auVar7 = vblendps_avx(auVar170,_DAT_01f7aa10,0xe);
              auVar191 = vrsqrtss_avx(auVar7,auVar7);
              fVar118 = auVar170._0_4_;
              fVar95 = auVar191._0_4_;
              auVar191 = vdpps_avx(auVar214,auVar8,0x7f);
              fVar95 = fVar95 * 1.5 + fVar118 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar110._0_4_ = auVar8._0_4_ * fVar118;
              auVar110._4_4_ = auVar8._4_4_ * fVar118;
              auVar110._8_4_ = auVar8._8_4_ * fVar118;
              auVar110._12_4_ = auVar8._12_4_ * fVar118;
              fVar117 = auVar191._0_4_;
              auVar194._0_4_ = auVar214._0_4_ * fVar117;
              auVar194._4_4_ = auVar214._4_4_ * fVar117;
              auVar194._8_4_ = auVar214._8_4_ * fVar117;
              auVar194._12_4_ = auVar214._12_4_ * fVar117;
              auVar191 = vsubps_avx(auVar110,auVar194);
              auVar7 = vrcpss_avx(auVar7,auVar7);
              auVar8 = vfnmadd213ss_fma(auVar7,auVar170,ZEXT416(0x40000000));
              fVar117 = auVar7._0_4_ * auVar8._0_4_;
              auVar7 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                  ZEXT416((uint)(fVar120 * (float)local_800._0_4_)));
              uVar59 = CONCAT44(auVar214._4_4_,auVar214._0_4_);
              auVar227._0_8_ = uVar59 ^ 0x8000000080000000;
              auVar227._8_4_ = -auVar214._8_4_;
              auVar227._12_4_ = -auVar214._12_4_;
              local_840._0_4_ = fVar95 * auVar191._0_4_ * fVar117;
              local_840._4_4_ = fVar95 * auVar191._4_4_ * fVar117;
              local_840._8_4_ = fVar95 * auVar191._8_4_ * fVar117;
              local_840._12_4_ = fVar95 * auVar191._12_4_ * fVar117;
              local_820._0_4_ = auVar214._0_4_ * fVar95;
              local_820._4_4_ = auVar214._4_4_ * fVar95;
              local_820._8_4_ = auVar214._8_4_ * fVar95;
              local_820._12_4_ = auVar214._12_4_ * fVar95;
              local_8e0._0_16_ = auVar214;
              if (fVar118 < -fVar118) {
                local_a00._0_4_ = auVar79._0_4_;
                local_a20._0_16_ = auVar227;
                fVar95 = sqrtf(fVar118);
                auVar79 = ZEXT416((uint)local_a00._0_4_);
                auVar227 = local_a20._0_16_;
                auVar170 = local_820._0_16_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar170,auVar170);
                fVar95 = auVar170._0_4_;
                auVar170 = local_820._0_16_;
              }
              auVar233 = ZEXT1664(auVar170);
              local_a00._0_16_ = vdpps_avx(_local_7a0,auVar170,0x7f);
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar79,
                                        ZEXT416((uint)auVar7._0_4_));
              auVar191 = vdpps_avx(auVar227,auVar170,0x7f);
              auVar8 = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar72 = vdpps_avx(local_780._0_16_,auVar170,0x7f);
              auVar79 = vfmadd213ss_fma(ZEXT416((uint)(auVar79._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar95)),auVar71);
              local_a20._0_4_ = auVar79._0_4_;
              auVar80._0_4_ = local_a00._0_4_ * local_a00._0_4_;
              auVar80._4_4_ = local_a00._4_4_ * local_a00._4_4_;
              auVar80._8_4_ = local_a00._8_4_ * local_a00._8_4_;
              auVar80._12_4_ = local_a00._12_4_ * local_a00._12_4_;
              auVar79 = vdpps_avx(_local_7a0,auVar227,0x7f);
              auVar123 = vsubps_avx(local_a40._0_16_,auVar80);
              auVar71 = vrsqrtss_avx(auVar123,auVar123);
              fVar117 = auVar123._0_4_;
              fVar95 = auVar71._0_4_;
              fVar95 = fVar95 * 1.5 + fVar117 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar71 = vdpps_avx(_local_7a0,local_780._0_16_,0x7f);
              local_820._0_16_ = ZEXT416((uint)(auVar191._0_4_ + auVar8._0_4_));
              local_840._0_16_ = vfnmadd231ss_fma(auVar79,local_a00._0_16_,local_820._0_16_);
              auVar79 = vfnmadd231ss_fma(auVar71,local_a00._0_16_,auVar72);
              if (fVar117 < 0.0) {
                local_5e0._0_16_ = auVar72;
                local_600._0_4_ = fVar95;
                local_620._0_16_ = auVar79;
                auVar233 = ZEXT1664(auVar170);
                fVar117 = sqrtf(fVar117);
                fVar95 = (float)local_600._0_4_;
                auVar79 = local_620._0_16_;
                auVar72 = local_5e0._0_16_;
              }
              else {
                auVar170 = vsqrtss_avx(auVar123,auVar123);
                fVar117 = auVar170._0_4_;
              }
              auVar243 = ZEXT1664(local_a40._0_16_);
              auVar258 = ZEXT3264(local_980);
              auVar248 = ZEXT3264(local_9a0);
              auVar253 = ZEXT3264(local_9c0);
              auVar218 = ZEXT3264(local_9e0);
              auVar224 = ZEXT3264(local_900);
              auVar230 = ZEXT1664(local_8e0._0_16_);
              auVar170 = vpermilps_avx(local_5c0._0_16_,0xff);
              fVar117 = fVar117 - auVar170._0_4_;
              auVar191 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xff);
              auVar170 = vfmsub213ss_fma(local_840._0_16_,ZEXT416((uint)fVar95),auVar191);
              auVar150._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar150._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar150._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar174._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
              auVar174._8_4_ = auVar170._8_4_ ^ 0x80000000;
              auVar174._12_4_ = auVar170._12_4_ ^ 0x80000000;
              auVar79 = ZEXT416((uint)(auVar79._0_4_ * fVar95));
              auVar170 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar170._0_4_)),
                                         local_820._0_16_,auVar79);
              auVar79 = vinsertps_avx(auVar174,auVar79,0x1c);
              uVar67 = auVar170._0_4_;
              auVar175._4_4_ = uVar67;
              auVar175._0_4_ = uVar67;
              auVar175._8_4_ = uVar67;
              auVar175._12_4_ = uVar67;
              auVar79 = vdivps_avx(auVar79,auVar175);
              auVar170 = vinsertps_avx(local_820._0_16_,auVar150,0x10);
              auVar170 = vdivps_avx(auVar170,auVar175);
              fVar95 = local_a00._0_4_;
              auVar128._0_4_ = fVar95 * auVar79._0_4_ + fVar117 * auVar170._0_4_;
              auVar128._4_4_ = fVar95 * auVar79._4_4_ + fVar117 * auVar170._4_4_;
              auVar128._8_4_ = fVar95 * auVar79._8_4_ + fVar117 * auVar170._8_4_;
              auVar128._12_4_ = fVar95 * auVar79._12_4_ + fVar117 * auVar170._12_4_;
              auVar124 = vsubps_avx(auVar124,auVar128);
              auVar79 = vandps_avx(local_a00._0_16_,local_950);
              if (auVar79._0_4_ < (float)local_a20._0_4_) {
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a20._0_4_ + auVar7._0_4_)),
                                         local_640._0_16_,ZEXT416(0x36000000));
                auVar79 = vandps_avx(ZEXT416((uint)fVar117),local_950);
                if (auVar79._0_4_ < auVar7._0_4_) {
                  fVar95 = auVar124._0_4_ + (float)local_750._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar95) &&
                     (fVar117 = (ray->super_RayK<1>).tfar, fVar95 <= fVar117)) {
                    auVar124 = vmovshdup_avx(auVar124);
                    fVar118 = auVar124._0_4_;
                    if ((0.0 <= fVar118) && (fVar118 <= 1.0)) {
                      auVar124 = vrsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                      fVar119 = auVar124._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar58].ptr;
                      if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar119 = fVar119 * 1.5 +
                                  local_a40._0_4_ * -0.5 * fVar119 * fVar119 * fVar119;
                        auVar151._0_4_ = fVar119 * (float)local_7a0._0_4_;
                        auVar151._4_4_ = fVar119 * (float)local_7a0._4_4_;
                        auVar151._8_4_ = fVar119 * fStack_798;
                        auVar151._12_4_ = fVar119 * fStack_794;
                        auVar170 = vfmadd213ps_fma(auVar191,auVar151,local_8e0._0_16_);
                        auVar124 = vshufps_avx(auVar151,auVar151,0xc9);
                        auVar79 = vshufps_avx(local_8e0._0_16_,local_8e0._0_16_,0xc9);
                        auVar152._0_4_ = auVar151._0_4_ * auVar79._0_4_;
                        auVar152._4_4_ = auVar151._4_4_ * auVar79._4_4_;
                        auVar152._8_4_ = auVar151._8_4_ * auVar79._8_4_;
                        auVar152._12_4_ = auVar151._12_4_ * auVar79._12_4_;
                        auVar7 = vfmsub231ps_fma(auVar152,local_8e0._0_16_,auVar124);
                        auVar124 = vshufps_avx(auVar7,auVar7,0xc9);
                        auVar79 = vshufps_avx(auVar170,auVar170,0xc9);
                        auVar7 = vshufps_avx(auVar7,auVar7,0xd2);
                        auVar81._0_4_ = auVar170._0_4_ * auVar7._0_4_;
                        auVar81._4_4_ = auVar170._4_4_ * auVar7._4_4_;
                        auVar81._8_4_ = auVar170._8_4_ * auVar7._8_4_;
                        auVar81._12_4_ = auVar170._12_4_ * auVar7._12_4_;
                        auVar124 = vfmsub231ps_fma(auVar81,auVar124,auVar79);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar95;
                          auVar79 = vshufps_avx(auVar124,auVar124,0xe9);
                          uVar68 = vmovlps_avx(auVar79);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar68;
                          (ray->Ng).field_0.field_0.z = auVar124._0_4_;
                          ray->u = fVar118;
                          ray->v = 0.0;
                          ray->primID = (uint)local_880;
                          ray->geomID = uVar58;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar79 = vshufps_avx(auVar124,auVar124,0xe9);
                          local_8b0 = vmovlps_avx(auVar79);
                          local_8a8 = auVar124._0_4_;
                          local_8a4 = fVar118;
                          local_8a0 = 0;
                          local_89c = (uint)local_880;
                          local_898 = uVar58;
                          local_894 = context->user->instID[0];
                          local_890 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar95;
                          local_a44 = -1;
                          local_a78.valid = &local_a44;
                          local_a78.geometryUserPtr = pGVar4->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8b0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0162fa32:
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar230 = ZEXT1664(auVar230._0_16_);
                              auVar233 = ZEXT1664(auVar233._0_16_);
                              auVar243 = ZEXT1664(auVar243._0_16_);
                              (*p_Var5)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_0162fac0;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar230 = ZEXT1664(local_8e0._0_16_);
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            auVar243 = ZEXT1664(local_a40._0_16_);
                            (*pGVar4->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_0162fa32;
LAB_0162fac0:
                            (ray->super_RayK<1>).tfar = fVar117;
                          }
                          auVar258 = ZEXT3264(local_980);
                          auVar248 = ZEXT3264(local_9a0);
                          auVar253 = ZEXT3264(local_9c0);
                          auVar218 = ZEXT3264(local_9e0);
                          auVar224 = ZEXT3264(local_900);
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar64 = lVar64 + -1;
            } while (lVar64 != 0);
            auVar9 = local_5a0;
            fVar95 = (ray->super_RayK<1>).tfar;
            auVar90._4_4_ = fVar95;
            auVar90._0_4_ = fVar95;
            auVar90._8_4_ = fVar95;
            auVar90._12_4_ = fVar95;
            auVar90._16_4_ = fVar95;
            auVar90._20_4_ = fVar95;
            auVar90._24_4_ = fVar95;
            auVar90._28_4_ = fVar95;
            auVar83 = vcmpps_avx(_local_6c0,auVar90,2);
            local_5a0 = vandps_avx(auVar83,local_5a0);
            auVar9 = auVar9 & auVar83;
          } while ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar9 >> 0x7f,0) != '\0') ||
                     (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar9 >> 0xbf,0) != '\0') ||
                   (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar9[0x1f] < '\0');
        }
        auVar138._0_4_ = (float)local_7e0._0_4_ + local_3a0._0_4_;
        auVar138._4_4_ = (float)local_7e0._4_4_ + local_3a0._4_4_;
        auVar138._8_4_ = fStack_7d8 + local_3a0._8_4_;
        auVar138._12_4_ = fStack_7d4 + local_3a0._12_4_;
        auVar138._16_4_ = fStack_7d0 + local_3a0._16_4_;
        auVar138._20_4_ = fStack_7cc + local_3a0._20_4_;
        auVar138._24_4_ = fStack_7c8 + local_3a0._24_4_;
        auVar138._28_4_ = fStack_7c4 + local_3a0._28_4_;
        auVar9 = vcmpps_avx(auVar138,auVar90,2);
        auVar83 = vandps_avx(local_460,local_560);
        auVar83 = vandps_avx(auVar9,auVar83);
        auVar160._0_4_ = (float)local_7e0._0_4_ + local_3e0._0_4_;
        auVar160._4_4_ = (float)local_7e0._4_4_ + local_3e0._4_4_;
        auVar160._8_4_ = fStack_7d8 + local_3e0._8_4_;
        auVar160._12_4_ = fStack_7d4 + local_3e0._12_4_;
        auVar160._16_4_ = fStack_7d0 + local_3e0._16_4_;
        auVar160._20_4_ = fStack_7cc + local_3e0._20_4_;
        auVar160._24_4_ = fStack_7c8 + local_3e0._24_4_;
        auVar160._28_4_ = fStack_7c4 + local_3e0._28_4_;
        auVar240 = vcmpps_avx(auVar160,auVar90,2);
        auVar9 = vandps_avx(local_720,local_700);
        auVar9 = vandps_avx(auVar240,auVar9);
        auVar9 = vorps_avx(auVar83,auVar9);
        if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0x7f,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0xbf,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar9[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar63 * 0x60) = auVar9;
          auVar83 = vblendvps_avx(local_3e0,local_3a0,auVar83);
          *(undefined1 (*) [32])(auStack_160 + uVar63 * 0x60) = auVar83;
          uVar68 = vmovlps_avx(local_3f0);
          (&uStack_140)[uVar63 * 0xc] = uVar68;
          aiStack_138[uVar63 * 0x18] = local_acc + 1;
          iVar66 = iVar66 + 1;
        }
      }
    }
    fVar95 = (ray->super_RayK<1>).tfar;
    if (iVar66 == 0) break;
    fVar117 = (ray->super_RayK<1>).tfar;
    auVar111._4_4_ = fVar117;
    auVar111._0_4_ = fVar117;
    auVar111._8_4_ = fVar117;
    auVar111._12_4_ = fVar117;
    auVar111._16_4_ = fVar117;
    auVar111._20_4_ = fVar117;
    auVar111._24_4_ = fVar117;
    auVar111._28_4_ = fVar117;
    uVar61 = -iVar66;
    pauVar60 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar66 - 1) * 0x60);
    fVar117 = (float)local_7e0._0_4_;
    fVar118 = (float)local_7e0._4_4_;
    fVar119 = fStack_7d8;
    fVar122 = fStack_7d4;
    fVar120 = fStack_7d0;
    fVar121 = fStack_7cc;
    fVar184 = fStack_7c8;
    fVar94 = fStack_7c4;
    while( true ) {
      auVar83 = pauVar60[1];
      auVar131._0_4_ = fVar117 + auVar83._0_4_;
      auVar131._4_4_ = fVar118 + auVar83._4_4_;
      auVar131._8_4_ = fVar119 + auVar83._8_4_;
      auVar131._12_4_ = fVar122 + auVar83._12_4_;
      auVar131._16_4_ = fVar120 + auVar83._16_4_;
      auVar131._20_4_ = fVar121 + auVar83._20_4_;
      auVar131._24_4_ = fVar184 + auVar83._24_4_;
      auVar131._28_4_ = fVar94 + auVar83._28_4_;
      auVar240 = vcmpps_avx(auVar131,auVar111,2);
      auVar9 = vandps_avx(auVar240,*pauVar60);
      local_3a0 = auVar9;
      auVar240 = *pauVar60 & auVar240;
      if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar240 >> 0x7f,0) != '\0') ||
            (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar240 >> 0xbf,0) != '\0') ||
          (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar240[0x1f] < '\0') break;
      pauVar60 = pauVar60 + -3;
      uVar61 = uVar61 + 1;
      fVar117 = (float)local_7e0._0_4_;
      fVar118 = (float)local_7e0._4_4_;
      fVar119 = fStack_7d8;
      fVar122 = fStack_7d4;
      fVar120 = fStack_7d0;
      fVar121 = fStack_7cc;
      fVar184 = fStack_7c8;
      fVar94 = fStack_7c4;
      if (uVar61 == 0) goto LAB_0162fc83;
    }
    auVar88._8_4_ = 0x7f800000;
    auVar88._0_8_ = 0x7f8000007f800000;
    auVar88._12_4_ = 0x7f800000;
    auVar88._16_4_ = 0x7f800000;
    auVar88._20_4_ = 0x7f800000;
    auVar88._24_4_ = 0x7f800000;
    auVar88._28_4_ = 0x7f800000;
    auVar83 = vblendvps_avx(auVar88,auVar83,auVar9);
    auVar240 = vshufps_avx(auVar83,auVar83,0xb1);
    auVar240 = vminps_avx(auVar83,auVar240);
    auVar154 = vshufpd_avx(auVar240,auVar240,5);
    auVar240 = vminps_avx(auVar240,auVar154);
    auVar154 = vpermpd_avx2(auVar240,0x4e);
    auVar240 = vminps_avx(auVar240,auVar154);
    auVar83 = vcmpps_avx(auVar83,auVar240,0);
    auVar240 = auVar9 & auVar83;
    if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar240 >> 0x7f,0) != '\0') ||
          (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar240 >> 0xbf,0) != '\0') ||
        (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar240[0x1f] < '\0') {
      auVar9 = vandps_avx(auVar83,auVar9);
    }
    uVar59 = *(ulong *)pauVar60[2];
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar59;
    uVar62 = vmovmskps_avx(auVar9);
    iVar66 = 0;
    for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
      iVar66 = iVar66 + 1;
    }
    *(undefined4 *)(local_3a0 + (uint)(iVar66 << 2)) = 0;
    uVar62 = ~uVar61;
    if ((((((((local_3a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_3a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_3a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_3a0 >> 0x7f,0) != '\0') ||
          (local_3a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_3a0 >> 0xbf,0) != '\0') ||
        (local_3a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_3a0[0x1f] < '\0') {
      uVar62 = -uVar61;
    }
    uVar63 = (ulong)uVar62;
    local_acc = *(int *)(pauVar60[2] + 8);
    *pauVar60 = local_3a0;
    uVar67 = (undefined4)uVar59;
    auVar112._4_4_ = uVar67;
    auVar112._0_4_ = uVar67;
    auVar112._8_4_ = uVar67;
    auVar112._12_4_ = uVar67;
    auVar112._16_4_ = uVar67;
    auVar112._20_4_ = uVar67;
    auVar112._24_4_ = uVar67;
    auVar112._28_4_ = uVar67;
    auVar124 = vmovshdup_avx(auVar74);
    auVar124 = vsubps_avx(auVar124,auVar74);
    auVar89._0_4_ = auVar124._0_4_;
    auVar89._4_4_ = auVar89._0_4_;
    auVar89._8_4_ = auVar89._0_4_;
    auVar89._12_4_ = auVar89._0_4_;
    auVar89._16_4_ = auVar89._0_4_;
    auVar89._20_4_ = auVar89._0_4_;
    auVar89._24_4_ = auVar89._0_4_;
    auVar89._28_4_ = auVar89._0_4_;
    auVar124 = vfmadd132ps_fma(auVar89,auVar112,_DAT_01faff20);
    local_3e0 = ZEXT1632(auVar124);
    local_3f0._8_8_ = 0;
    local_3f0._0_8_ = *(ulong *)(local_3e0 + (uint)(iVar66 << 2));
    uVar59 = local_880;
  } while( true );
LAB_0162fc83:
  auVar82._4_4_ = fVar95;
  auVar82._0_4_ = fVar95;
  auVar82._8_4_ = fVar95;
  auVar82._12_4_ = fVar95;
  auVar124 = vcmpps_avx(local_400,auVar82,2);
  uVar58 = vmovmskps_avx(auVar124);
  uVar58 = (uint)uVar65 & uVar58;
  if (uVar58 == 0) {
    return;
  }
  goto LAB_0162d6b7;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }